

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersectorK<8,8>::
     occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int iVar17;
  long lVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [12];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  byte bVar100;
  uint uVar101;
  int iVar102;
  undefined1 (*pauVar103) [32];
  uint uVar104;
  uint uVar105;
  ulong uVar106;
  ulong uVar107;
  ulong uVar108;
  bool bVar109;
  bool bVar110;
  float fVar111;
  float fVar113;
  float fVar143;
  undefined1 auVar114 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined4 uVar112;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar115 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [64];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar188 [32];
  float fVar189;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [64];
  float fVar209;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar219;
  float fVar220;
  undefined1 auVar216 [32];
  float fVar221;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  float fVar222;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar231;
  float fVar232;
  float fVar234;
  float fVar235;
  float fVar236;
  undefined1 auVar226 [32];
  float fVar233;
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [64];
  float fVar239;
  undefined8 uVar240;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  float fVar251;
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  float fVar264;
  float fVar265;
  float fVar266;
  undefined1 auVar263 [64];
  float fVar282;
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar267 [16];
  undefined1 auVar268 [64];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [32];
  float fVar272;
  undefined1 in_ZMM10 [64];
  undefined1 auVar273 [16];
  undefined1 auVar274 [32];
  undefined1 auVar276 [64];
  undefined1 auVar277 [16];
  float fVar283;
  float fVar284;
  float fVar285;
  undefined1 in_ZMM12 [64];
  undefined1 auVar281 [64];
  float s;
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  float fVar291;
  undefined1 auVar290 [64];
  undefined1 auVar292 [32];
  undefined1 auVar293 [64];
  undefined1 auVar294 [64];
  float fVar295;
  float fVar300;
  undefined1 auVar296 [16];
  float fVar298;
  float fVar299;
  float fVar301;
  float fVar302;
  float fVar303;
  undefined1 auVar297 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_c88;
  float local_ba0;
  float fStack_b7c;
  float fStack_b78;
  float fStack_b74;
  undefined4 local_b00;
  RTCFilterFunctionNArguments local_a90;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  undefined1 local_a40 [28];
  uint uStack_a24;
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 auStack_9b0 [16];
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [16];
  Primitive *local_910;
  ulong local_908;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  uint local_680;
  uint uStack_67c;
  uint uStack_678;
  uint uStack_674;
  uint uStack_670;
  uint uStack_66c;
  uint uStack_668;
  uint uStack_664;
  uint local_660;
  uint uStack_65c;
  uint uStack_658;
  uint uStack_654;
  uint uStack_650;
  uint uStack_64c;
  uint uStack_648;
  uint uStack_644;
  undefined1 local_640 [32];
  undefined4 local_620;
  undefined4 uStack_61c;
  undefined4 uStack_618;
  undefined4 uStack_614;
  undefined4 uStack_610;
  undefined4 uStack_60c;
  undefined4 uStack_608;
  undefined4 uStack_604;
  undefined4 local_600;
  undefined4 uStack_5fc;
  undefined4 uStack_5f8;
  undefined4 uStack_5f4;
  undefined4 uStack_5f0;
  undefined4 uStack_5ec;
  undefined4 uStack_5e8;
  undefined4 uStack_5e4;
  undefined4 local_5e0;
  undefined4 uStack_5dc;
  undefined4 uStack_5d8;
  undefined4 uStack_5d4;
  undefined4 uStack_5d0;
  undefined4 uStack_5cc;
  undefined4 uStack_5c8;
  undefined4 uStack_5c4;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined4 local_3e0;
  undefined4 uStack_3dc;
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [32];
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [32];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined1 local_2a0 [32];
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar275 [64];
  
  PVar7 = prim[1];
  uVar106 = (ulong)(byte)PVar7;
  fVar111 = *(float *)(prim + uVar106 * 0x19 + 0x12);
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar11 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar11 = vinsertps_avx(auVar11,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar10 = vsubps_avx(auVar10,*(undefined1 (*) [16])(prim + uVar106 * 0x19 + 6));
  auVar114._0_4_ = fVar111 * auVar10._0_4_;
  auVar114._4_4_ = fVar111 * auVar10._4_4_;
  auVar114._8_4_ = fVar111 * auVar10._8_4_;
  auVar114._12_4_ = fVar111 * auVar10._12_4_;
  auVar173._0_4_ = fVar111 * auVar11._0_4_;
  auVar173._4_4_ = fVar111 * auVar11._4_4_;
  auVar173._8_4_ = fVar111 * auVar11._8_4_;
  auVar173._12_4_ = fVar111 * auVar11._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar106 * 4 + 6);
  auVar126 = vpmovsxbd_avx2(auVar10);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar106 * 5 + 6);
  auVar271 = vpmovsxbd_avx2(auVar11);
  auVar271 = vcvtdq2ps_avx(auVar271);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + uVar106 * 6 + 6);
  auVar187 = vpmovsxbd_avx2(auVar1);
  auVar187 = vcvtdq2ps_avx(auVar187);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + uVar106 * 0xb + 6);
  auVar13 = vpmovsxbd_avx2(auVar2);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6);
  auVar14 = vpmovsxbd_avx2(auVar3);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + (uint)(byte)PVar7 * 0xc + uVar106 + 6);
  auVar15 = vpmovsxbd_avx2(auVar4);
  auVar15 = vcvtdq2ps_avx(auVar15);
  uVar107 = (ulong)(uint)((int)(uVar106 * 9) * 2);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar107 + 6);
  auVar134 = vpmovsxbd_avx2(auVar5);
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar107 + uVar106 + 6);
  auVar16 = vpmovsxbd_avx2(auVar6);
  auVar16 = vcvtdq2ps_avx(auVar16);
  uVar107 = (ulong)(uint)((int)(uVar106 * 5) << 2);
  auVar296._8_8_ = 0;
  auVar296._0_8_ = *(ulong *)(prim + uVar107 + 6);
  auVar129 = vpmovsxbd_avx2(auVar296);
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar290 = ZEXT3264(auVar129);
  auVar274._4_4_ = auVar173._0_4_;
  auVar274._0_4_ = auVar173._0_4_;
  auVar274._8_4_ = auVar173._0_4_;
  auVar274._12_4_ = auVar173._0_4_;
  auVar274._16_4_ = auVar173._0_4_;
  auVar274._20_4_ = auVar173._0_4_;
  auVar274._24_4_ = auVar173._0_4_;
  auVar274._28_4_ = auVar173._0_4_;
  auVar10 = vmovshdup_avx(auVar173);
  uVar240 = auVar10._0_8_;
  auVar297._8_8_ = uVar240;
  auVar297._0_8_ = uVar240;
  auVar297._16_8_ = uVar240;
  auVar297._24_8_ = uVar240;
  auVar10 = vshufps_avx(auVar173,auVar173,0xaa);
  fVar111 = auVar10._0_4_;
  auVar208._0_4_ = fVar111 * auVar187._0_4_;
  fVar143 = auVar10._4_4_;
  auVar208._4_4_ = fVar143 * auVar187._4_4_;
  auVar208._8_4_ = fVar111 * auVar187._8_4_;
  auVar208._12_4_ = fVar143 * auVar187._12_4_;
  auVar208._16_4_ = fVar111 * auVar187._16_4_;
  auVar208._20_4_ = fVar143 * auVar187._20_4_;
  auVar208._28_36_ = in_ZMM12._28_36_;
  auVar208._24_4_ = fVar111 * auVar187._24_4_;
  auVar293._0_4_ = auVar15._0_4_ * fVar111;
  auVar293._4_4_ = auVar15._4_4_ * fVar143;
  auVar293._8_4_ = auVar15._8_4_ * fVar111;
  auVar293._12_4_ = auVar15._12_4_ * fVar143;
  auVar293._16_4_ = auVar15._16_4_ * fVar111;
  auVar293._20_4_ = auVar15._20_4_ * fVar143;
  auVar293._28_36_ = in_ZMM10._28_36_;
  auVar293._24_4_ = auVar15._24_4_ * fVar111;
  auVar227._0_4_ = auVar129._0_4_ * fVar111;
  auVar227._4_4_ = auVar129._4_4_ * fVar143;
  auVar227._8_4_ = auVar129._8_4_ * fVar111;
  auVar227._12_4_ = auVar129._12_4_ * fVar143;
  auVar227._16_4_ = auVar129._16_4_ * fVar111;
  auVar227._20_4_ = auVar129._20_4_ * fVar143;
  auVar227._24_4_ = auVar129._24_4_ * fVar111;
  auVar227._28_4_ = 0;
  auVar10 = vfmadd231ps_fma(auVar208._0_32_,auVar297,auVar271);
  auVar11 = vfmadd231ps_fma(auVar293._0_32_,auVar297,auVar14);
  auVar1 = vfmadd231ps_fma(auVar227,auVar16,auVar297);
  auVar2 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar274,auVar126);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar274,auVar13);
  auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar134,auVar274);
  auVar292._4_4_ = auVar114._0_4_;
  auVar292._0_4_ = auVar114._0_4_;
  auVar292._8_4_ = auVar114._0_4_;
  auVar292._12_4_ = auVar114._0_4_;
  auVar292._16_4_ = auVar114._0_4_;
  auVar292._20_4_ = auVar114._0_4_;
  auVar292._24_4_ = auVar114._0_4_;
  auVar292._28_4_ = auVar114._0_4_;
  auVar293 = ZEXT3264(auVar292);
  auVar10 = vmovshdup_avx(auVar114);
  uVar240 = auVar10._0_8_;
  auVar243._8_8_ = uVar240;
  auVar243._0_8_ = uVar240;
  auVar243._16_8_ = uVar240;
  auVar243._24_8_ = uVar240;
  auVar10 = vshufps_avx(auVar114,auVar114,0xaa);
  fVar111 = auVar10._0_4_;
  auVar130._0_4_ = fVar111 * auVar187._0_4_;
  fVar143 = auVar10._4_4_;
  auVar130._4_4_ = fVar143 * auVar187._4_4_;
  auVar130._8_4_ = fVar111 * auVar187._8_4_;
  auVar130._12_4_ = fVar143 * auVar187._12_4_;
  auVar130._16_4_ = fVar111 * auVar187._16_4_;
  auVar130._20_4_ = fVar143 * auVar187._20_4_;
  auVar130._24_4_ = fVar111 * auVar187._24_4_;
  auVar130._28_4_ = 0;
  auVar259._4_4_ = auVar15._4_4_ * fVar143;
  auVar259._0_4_ = auVar15._0_4_ * fVar111;
  auVar259._8_4_ = auVar15._8_4_ * fVar111;
  auVar259._12_4_ = auVar15._12_4_ * fVar143;
  auVar259._16_4_ = auVar15._16_4_ * fVar111;
  auVar259._20_4_ = auVar15._20_4_ * fVar143;
  auVar259._24_4_ = auVar15._24_4_ * fVar111;
  auVar259._28_4_ = auVar187._28_4_;
  auVar187._4_4_ = auVar129._4_4_ * fVar143;
  auVar187._0_4_ = auVar129._0_4_ * fVar111;
  auVar187._8_4_ = auVar129._8_4_ * fVar111;
  auVar187._12_4_ = auVar129._12_4_ * fVar143;
  auVar187._16_4_ = auVar129._16_4_ * fVar111;
  auVar187._20_4_ = auVar129._20_4_ * fVar143;
  auVar187._24_4_ = auVar129._24_4_ * fVar111;
  auVar187._28_4_ = fVar143;
  auVar10 = vfmadd231ps_fma(auVar130,auVar243,auVar271);
  auVar3 = vfmadd231ps_fma(auVar259,auVar243,auVar14);
  auVar4 = vfmadd231ps_fma(auVar187,auVar243,auVar16);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar292,auVar126);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar292,auVar13);
  local_8c0._8_4_ = 0x7fffffff;
  local_8c0._0_8_ = 0x7fffffff7fffffff;
  local_8c0._12_4_ = 0x7fffffff;
  local_8c0._16_4_ = 0x7fffffff;
  local_8c0._20_4_ = 0x7fffffff;
  local_8c0._24_4_ = 0x7fffffff;
  local_8c0._28_4_ = 0x7fffffff;
  auVar178._8_4_ = 0x219392ef;
  auVar178._0_8_ = 0x219392ef219392ef;
  auVar178._12_4_ = 0x219392ef;
  auVar178._16_4_ = 0x219392ef;
  auVar178._20_4_ = 0x219392ef;
  auVar178._24_4_ = 0x219392ef;
  auVar178._28_4_ = 0x219392ef;
  auVar126 = vandps_avx(ZEXT1632(auVar2),local_8c0);
  auVar126 = vcmpps_avx(auVar126,auVar178,1);
  auVar271 = vblendvps_avx(ZEXT1632(auVar2),auVar178,auVar126);
  auVar126 = vandps_avx(ZEXT1632(auVar11),local_8c0);
  auVar126 = vcmpps_avx(auVar126,auVar178,1);
  auVar187 = vblendvps_avx(ZEXT1632(auVar11),auVar178,auVar126);
  auVar126 = vandps_avx(ZEXT1632(auVar1),local_8c0);
  auVar126 = vcmpps_avx(auVar126,auVar178,1);
  auVar126 = vblendvps_avx(ZEXT1632(auVar1),auVar178,auVar126);
  auVar2 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar292,auVar134);
  auVar13 = vrcpps_avx(auVar271);
  auVar226._8_4_ = 0x3f800000;
  auVar226._0_8_ = 0x3f8000003f800000;
  auVar226._12_4_ = 0x3f800000;
  auVar226._16_4_ = 0x3f800000;
  auVar226._20_4_ = 0x3f800000;
  auVar226._24_4_ = 0x3f800000;
  auVar226._28_4_ = 0x3f800000;
  auVar10 = vfnmadd213ps_fma(auVar271,auVar13,auVar226);
  auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar13,auVar13);
  auVar271 = vrcpps_avx(auVar187);
  auVar11 = vfnmadd213ps_fma(auVar187,auVar271,auVar226);
  auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar271,auVar271);
  auVar271 = vrcpps_avx(auVar126);
  auVar1 = vfnmadd213ps_fma(auVar126,auVar271,auVar226);
  auVar1 = vfmadd132ps_fma(ZEXT1632(auVar1),auVar271,auVar271);
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar106 * 7 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar5));
  auVar13._4_4_ = auVar10._4_4_ * auVar126._4_4_;
  auVar13._0_4_ = auVar10._0_4_ * auVar126._0_4_;
  auVar13._8_4_ = auVar10._8_4_ * auVar126._8_4_;
  auVar13._12_4_ = auVar10._12_4_ * auVar126._12_4_;
  auVar13._16_4_ = auVar126._16_4_ * 0.0;
  auVar13._20_4_ = auVar126._20_4_ * 0.0;
  auVar13._24_4_ = auVar126._24_4_ * 0.0;
  auVar13._28_4_ = auVar126._28_4_;
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar106 * 9 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar5));
  auVar14._4_4_ = auVar10._4_4_ * auVar126._4_4_;
  auVar14._0_4_ = auVar10._0_4_ * auVar126._0_4_;
  auVar14._8_4_ = auVar10._8_4_ * auVar126._8_4_;
  auVar14._12_4_ = auVar10._12_4_ * auVar126._12_4_;
  auVar14._16_4_ = auVar126._16_4_ * 0.0;
  auVar14._20_4_ = auVar126._20_4_ * 0.0;
  auVar14._24_4_ = auVar126._24_4_ * 0.0;
  auVar14._28_4_ = auVar126._28_4_;
  auVar152._1_3_ = 0;
  auVar152[0] = PVar7;
  auVar271 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar7 * 0x10 + 6));
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar7 * 0x10 + uVar106 * -2 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar3));
  auVar15._4_4_ = auVar126._4_4_ * auVar11._4_4_;
  auVar15._0_4_ = auVar126._0_4_ * auVar11._0_4_;
  auVar15._8_4_ = auVar126._8_4_ * auVar11._8_4_;
  auVar15._12_4_ = auVar126._12_4_ * auVar11._12_4_;
  auVar15._16_4_ = auVar126._16_4_ * 0.0;
  auVar15._20_4_ = auVar126._20_4_ * 0.0;
  auVar15._24_4_ = auVar126._24_4_ * 0.0;
  auVar15._28_4_ = auVar126._28_4_;
  auVar126 = vcvtdq2ps_avx(auVar271);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar3));
  auVar134._4_4_ = auVar11._4_4_ * auVar126._4_4_;
  auVar134._0_4_ = auVar11._0_4_ * auVar126._0_4_;
  auVar134._8_4_ = auVar11._8_4_ * auVar126._8_4_;
  auVar134._12_4_ = auVar11._12_4_ * auVar126._12_4_;
  auVar134._16_4_ = auVar126._16_4_ * 0.0;
  auVar134._20_4_ = auVar126._20_4_ * 0.0;
  auVar134._24_4_ = auVar126._24_4_ * 0.0;
  auVar134._28_4_ = auVar126._28_4_;
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar107 + uVar106 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar2));
  auVar16._4_4_ = auVar126._4_4_ * auVar1._4_4_;
  auVar16._0_4_ = auVar126._0_4_ * auVar1._0_4_;
  auVar16._8_4_ = auVar126._8_4_ * auVar1._8_4_;
  auVar16._12_4_ = auVar126._12_4_ * auVar1._12_4_;
  auVar16._16_4_ = auVar126._16_4_ * 0.0;
  auVar16._20_4_ = auVar126._20_4_ * 0.0;
  auVar16._24_4_ = auVar126._24_4_ * 0.0;
  auVar16._28_4_ = auVar126._28_4_;
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar106 * 0x17 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar2));
  auVar129._4_4_ = auVar1._4_4_ * auVar126._4_4_;
  auVar129._0_4_ = auVar1._0_4_ * auVar126._0_4_;
  auVar129._8_4_ = auVar1._8_4_ * auVar126._8_4_;
  auVar129._12_4_ = auVar1._12_4_ * auVar126._12_4_;
  auVar129._16_4_ = auVar126._16_4_ * 0.0;
  auVar129._20_4_ = auVar126._20_4_ * 0.0;
  auVar129._24_4_ = auVar126._24_4_ * 0.0;
  auVar129._28_4_ = auVar126._28_4_;
  auVar126 = vpminsd_avx2(auVar13,auVar14);
  auVar271 = vpminsd_avx2(auVar15,auVar134);
  auVar126 = vmaxps_avx(auVar126,auVar271);
  uVar112 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar153._4_4_ = uVar112;
  auVar153._0_4_ = uVar112;
  auVar153._8_4_ = uVar112;
  auVar153._12_4_ = uVar112;
  auVar153._16_4_ = uVar112;
  auVar153._20_4_ = uVar112;
  auVar153._24_4_ = uVar112;
  auVar153._28_4_ = uVar112;
  auVar271 = vpminsd_avx2(auVar16,auVar129);
  auVar271 = vmaxps_avx(auVar271,auVar153);
  auVar126 = vmaxps_avx(auVar126,auVar271);
  local_260._4_4_ = auVar126._4_4_ * 0.99999964;
  local_260._0_4_ = auVar126._0_4_ * 0.99999964;
  local_260._8_4_ = auVar126._8_4_ * 0.99999964;
  local_260._12_4_ = auVar126._12_4_ * 0.99999964;
  local_260._16_4_ = auVar126._16_4_ * 0.99999964;
  local_260._20_4_ = auVar126._20_4_ * 0.99999964;
  local_260._24_4_ = auVar126._24_4_ * 0.99999964;
  local_260._28_4_ = auVar271._28_4_;
  auVar126 = vpmaxsd_avx2(auVar13,auVar14);
  auVar271 = vpmaxsd_avx2(auVar15,auVar134);
  auVar126 = vminps_avx(auVar126,auVar271);
  auVar271 = vpmaxsd_avx2(auVar16,auVar129);
  uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar176._4_4_ = uVar112;
  auVar176._0_4_ = uVar112;
  auVar176._8_4_ = uVar112;
  auVar176._12_4_ = uVar112;
  auVar176._16_4_ = uVar112;
  auVar176._20_4_ = uVar112;
  auVar176._24_4_ = uVar112;
  auVar176._28_4_ = uVar112;
  auVar271 = vminps_avx(auVar271,auVar176);
  auVar126 = vminps_avx(auVar126,auVar271);
  auVar12._4_4_ = auVar126._4_4_ * 1.0000004;
  auVar12._0_4_ = auVar126._0_4_ * 1.0000004;
  auVar12._8_4_ = auVar126._8_4_ * 1.0000004;
  auVar12._12_4_ = auVar126._12_4_ * 1.0000004;
  auVar12._16_4_ = auVar126._16_4_ * 1.0000004;
  auVar12._20_4_ = auVar126._20_4_ * 1.0000004;
  auVar12._24_4_ = auVar126._24_4_ * 1.0000004;
  auVar12._28_4_ = auVar126._28_4_;
  auVar152[4] = PVar7;
  auVar152._5_3_ = 0;
  auVar152[8] = PVar7;
  auVar152._9_3_ = 0;
  auVar152[0xc] = PVar7;
  auVar152._13_3_ = 0;
  auVar152[0x10] = PVar7;
  auVar152._17_3_ = 0;
  auVar152[0x14] = PVar7;
  auVar152._21_3_ = 0;
  auVar152[0x18] = PVar7;
  auVar152._25_3_ = 0;
  auVar152[0x1c] = PVar7;
  auVar152._29_3_ = 0;
  auVar271 = vpcmpgtd_avx2(auVar152,_DAT_01fe9900);
  auVar126 = vcmpps_avx(local_260,auVar12,2);
  auVar126 = vandps_avx(auVar126,auVar271);
  uVar101 = vmovmskps_avx(auVar126);
  if (uVar101 == 0) {
    return false;
  }
  auVar126._16_16_ = mm_lookupmask_ps._240_16_;
  auVar126._0_16_ = mm_lookupmask_ps._240_16_;
  uVar101 = uVar101 & 0xff;
  local_7e0 = vblendps_avx(auVar126,ZEXT832(0) << 0x20,0x80);
  iVar102 = 1 << ((uint)k & 0x1f);
  auVar127._4_4_ = iVar102;
  auVar127._0_4_ = iVar102;
  auVar127._8_4_ = iVar102;
  auVar127._12_4_ = iVar102;
  auVar127._16_4_ = iVar102;
  auVar127._20_4_ = iVar102;
  auVar127._24_4_ = iVar102;
  auVar127._28_4_ = iVar102;
  auVar271 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar126 = vpand_avx2(auVar127,auVar271);
  local_6c0 = vpcmpeqd_avx2(auVar126,auVar271);
  local_910 = prim;
LAB_017e78e8:
  lVar18 = 0;
  local_908 = (ulong)uVar101;
  for (uVar107 = local_908; (uVar107 & 1) == 0; uVar107 = uVar107 >> 1 | 0x8000000000000000) {
    lVar18 = lVar18 + 1;
  }
  uVar101 = *(uint *)(local_910 + 2);
  local_680 = *(uint *)(local_910 + lVar18 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar101].ptr;
  uVar107 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                            pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i * (ulong)local_680);
  p_Var9 = pGVar8[1].intersectionFilterN;
  lVar18 = *(long *)&pGVar8[1].time_range.upper;
  auVar10 = *(undefined1 (*) [16])(lVar18 + (long)p_Var9 * uVar107);
  auVar11 = *(undefined1 (*) [16])(lVar18 + (uVar107 + 1) * (long)p_Var9);
  local_908 = local_908 - 1 & local_908;
  if (local_908 != 0) {
    uVar108 = local_908 - 1 & local_908;
    for (uVar106 = local_908; (uVar106 & 1) == 0; uVar106 = uVar106 >> 1 | 0x8000000000000000) {
    }
    if (uVar108 != 0) {
      for (; (uVar108 & 1) == 0; uVar108 = uVar108 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar1 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar2 = vinsertps_avx(auVar1,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar112 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar273._4_4_ = uVar112;
  auVar273._0_4_ = uVar112;
  auVar273._8_4_ = uVar112;
  auVar273._12_4_ = uVar112;
  fStack_850 = (float)uVar112;
  _local_860 = auVar273;
  fStack_84c = (float)uVar112;
  fStack_848 = (float)uVar112;
  register0x000014dc = uVar112;
  auVar275 = ZEXT3264(_local_860);
  uVar112 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar277._4_4_ = uVar112;
  auVar277._0_4_ = uVar112;
  auVar277._8_4_ = uVar112;
  auVar277._12_4_ = uVar112;
  fStack_a50 = (float)uVar112;
  _local_a60 = auVar277;
  fStack_a4c = (float)uVar112;
  fStack_a48 = (float)uVar112;
  register0x0000151c = uVar112;
  auVar281 = ZEXT3264(_local_a60);
  auVar1 = vunpcklps_avx(auVar273,auVar277);
  fVar111 = *(float *)(ray + k * 4 + 0xc0);
  auVar117._4_4_ = fVar111;
  auVar117._0_4_ = fVar111;
  auVar117._8_4_ = fVar111;
  auVar117._12_4_ = fVar111;
  auVar271._16_4_ = fVar111;
  auVar271._0_16_ = auVar117;
  auVar271._20_4_ = fVar111;
  auVar271._24_4_ = fVar111;
  auVar271._28_4_ = fVar111;
  local_990 = vinsertps_avx(auVar1,auVar117,0x28);
  auVar263 = ZEXT1664(local_990);
  auVar223._0_4_ = (auVar10._0_4_ + auVar11._0_4_) * 0.5;
  auVar223._4_4_ = (auVar10._4_4_ + auVar11._4_4_) * 0.5;
  auVar223._8_4_ = (auVar10._8_4_ + auVar11._8_4_) * 0.5;
  auVar223._12_4_ = (auVar10._12_4_ + auVar11._12_4_) * 0.5;
  auVar1 = vsubps_avx(auVar223,auVar2);
  auVar1 = vdpps_avx(auVar1,local_990,0x7f);
  local_9a0 = vdpps_avx(local_990,local_990,0x7f);
  auVar268 = ZEXT1664(local_9a0);
  auVar3 = vrcpss_avx(local_9a0,local_9a0);
  auVar4 = vfnmadd213ss_fma(auVar3,local_9a0,ZEXT416(0x40000000));
  local_240 = auVar1._0_4_ * auVar3._0_4_ * auVar4._0_4_;
  auVar122._4_4_ = local_240;
  auVar122._0_4_ = local_240;
  auVar122._8_4_ = local_240;
  auVar122._12_4_ = local_240;
  fStack_9d0 = local_240;
  _local_9e0 = auVar122;
  fStack_9cc = local_240;
  fStack_9c8 = local_240;
  fStack_9c4 = local_240;
  auVar1 = vfmadd231ps_fma(auVar2,local_990,auVar122);
  auVar1 = vblendps_avx(auVar1,_DAT_01f7aa10,8);
  auVar2 = vsubps_avx(auVar10,auVar1);
  auVar3 = vsubps_avx(*(undefined1 (*) [16])(lVar18 + (uVar107 + 2) * (long)p_Var9),auVar1);
  auVar4 = vsubps_avx(auVar11,auVar1);
  auVar1 = vsubps_avx(*(undefined1 (*) [16])(lVar18 + (uVar107 + 3) * (long)p_Var9),auVar1);
  auVar208 = ZEXT1664(auVar1);
  auVar10 = vmovshdup_avx(auVar2);
  local_480 = auVar10._0_8_;
  auVar10 = vshufps_avx(auVar2,auVar2,0xaa);
  local_4a0 = auVar10._0_8_;
  auVar10 = vshufps_avx(auVar2,auVar2,0xff);
  local_1e0 = auVar10._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar10 = vmovshdup_avx(auVar4);
  local_4c0 = auVar10._0_8_;
  auVar10 = vshufps_avx(auVar4,auVar4,0xaa);
  local_4e0 = auVar10._0_8_;
  auVar10 = vshufps_avx(auVar4,auVar4,0xff);
  local_500 = auVar10._0_8_;
  auVar10 = vmovshdup_avx(auVar3);
  local_520 = auVar10._0_8_;
  auVar10 = vshufps_avx(auVar3,auVar3,0xaa);
  local_540 = auVar10._0_8_;
  auVar10 = vshufps_avx(auVar3,auVar3,0xff);
  local_560 = auVar10._0_8_;
  auVar10 = vmovshdup_avx(auVar1);
  local_580 = auVar10._0_8_;
  auVar10 = vshufps_avx(auVar1,auVar1,0xaa);
  local_5a0 = auVar10._0_8_;
  auVar10 = vshufps_avx(auVar1,auVar1,0xff);
  local_5c0 = auVar10._0_8_;
  auVar10 = vfmadd231ps_fma(ZEXT432((uint)(fVar111 * fVar111)),_local_a60,_local_a60);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),_local_860,_local_860);
  uVar112 = auVar10._0_4_;
  local_200._4_4_ = uVar112;
  local_200._0_4_ = uVar112;
  local_200._8_4_ = uVar112;
  local_200._12_4_ = uVar112;
  local_200._16_4_ = uVar112;
  local_200._20_4_ = uVar112;
  local_200._24_4_ = uVar112;
  local_200._28_4_ = uVar112;
  fVar143 = *(float *)(ray + k * 4 + 0x60);
  local_920 = ZEXT416((uint)local_240);
  local_240 = fVar143 - local_240;
  fStack_23c = local_240;
  fStack_238 = local_240;
  fStack_234 = local_240;
  fStack_230 = local_240;
  fStack_22c = local_240;
  fStack_228 = local_240;
  fStack_224 = local_240;
  local_c88 = 1;
  uVar107 = 0;
  bVar109 = false;
  local_5e0 = auVar2._0_4_;
  local_600 = auVar4._0_4_;
  local_620 = auVar3._0_4_;
  fVar189 = auVar1._0_4_;
  local_220 = fVar189;
  fStack_21c = fVar189;
  fStack_218 = fVar189;
  fStack_214 = fVar189;
  fStack_210 = fVar189;
  fStack_20c = fVar189;
  fStack_208 = fVar189;
  fStack_204 = fVar189;
  local_640 = vandps_avx(local_200,local_8c0);
  auVar10 = vsqrtss_avx(local_9a0,local_9a0);
  auVar11 = vsqrtss_avx(local_9a0,local_9a0);
  auVar238 = ZEXT1664(ZEXT816(0x3f80000000000000));
  uStack_67c = local_680;
  uStack_678 = local_680;
  uStack_674 = local_680;
  uStack_670 = local_680;
  uStack_66c = local_680;
  uStack_668 = local_680;
  uStack_664 = local_680;
  local_660 = uVar101;
  uStack_65c = uVar101;
  uStack_658 = uVar101;
  uStack_654 = uVar101;
  uStack_650 = uVar101;
  uStack_64c = uVar101;
  uStack_648 = uVar101;
  uStack_644 = uVar101;
  uStack_61c = local_620;
  uStack_618 = local_620;
  uStack_614 = local_620;
  uStack_610 = local_620;
  uStack_60c = local_620;
  uStack_608 = local_620;
  uStack_604 = local_620;
  uStack_5fc = local_600;
  uStack_5f8 = local_600;
  uStack_5f4 = local_600;
  uStack_5f0 = local_600;
  uStack_5ec = local_600;
  uStack_5e8 = local_600;
  uStack_5e4 = local_600;
  uStack_5dc = local_5e0;
  uStack_5d8 = local_5e0;
  uStack_5d4 = local_5e0;
  uStack_5d0 = local_5e0;
  uStack_5cc = local_5e0;
  uStack_5c8 = local_5e0;
  uStack_5c4 = local_5e0;
  uStack_5b8 = local_5c0;
  uStack_5b0 = local_5c0;
  uStack_5a8 = local_5c0;
  uStack_598 = local_5a0;
  uStack_590 = local_5a0;
  uStack_588 = local_5a0;
  uStack_578 = local_580;
  uStack_570 = local_580;
  uStack_568 = local_580;
  uStack_558 = local_560;
  uStack_550 = local_560;
  uStack_548 = local_560;
  uStack_538 = local_540;
  uStack_530 = local_540;
  uStack_528 = local_540;
  uStack_518 = local_520;
  uStack_510 = local_520;
  uStack_508 = local_520;
  uStack_4f8 = local_500;
  uStack_4f0 = local_500;
  uStack_4e8 = local_500;
  uStack_4d8 = local_4e0;
  uStack_4d0 = local_4e0;
  uStack_4c8 = local_4e0;
  uStack_4b8 = local_4c0;
  uStack_4b0 = local_4c0;
  uStack_4a8 = local_4c0;
  uStack_498 = local_4a0;
  uStack_490 = local_4a0;
  uStack_488 = local_4a0;
  uStack_478 = local_480;
  uStack_470 = local_480;
  uStack_468 = local_480;
  do {
    auVar216._8_4_ = 0x3f800000;
    auVar216._0_8_ = 0x3f8000003f800000;
    auVar216._12_4_ = 0x3f800000;
    auVar216._16_4_ = 0x3f800000;
    auVar216._20_4_ = 0x3f800000;
    auVar216._24_4_ = 0x3f800000;
    auVar216._28_4_ = 0x3f800000;
    iVar102 = (int)uVar107;
    local_6d0 = auVar238._0_16_;
    auVar5 = vmovshdup_avx(local_6d0);
    auVar5 = vsubps_avx(auVar5,local_6d0);
    local_a20._0_4_ = auVar5._0_4_;
    fVar209 = (float)local_a20._0_4_ * 0.04761905;
    auVar237._0_4_ = auVar238._0_4_;
    auVar237._4_4_ = auVar237._0_4_;
    auVar237._8_4_ = auVar237._0_4_;
    auVar237._12_4_ = auVar237._0_4_;
    auVar237._16_4_ = auVar237._0_4_;
    auVar237._20_4_ = auVar237._0_4_;
    auVar237._24_4_ = auVar237._0_4_;
    auVar237._28_4_ = auVar237._0_4_;
    local_a20._4_4_ = local_a20._0_4_;
    local_a20._8_4_ = local_a20._0_4_;
    local_a20._12_4_ = local_a20._0_4_;
    local_a20._16_4_ = local_a20._0_4_;
    local_a20._20_4_ = local_a20._0_4_;
    local_a20._24_4_ = local_a20._0_4_;
    local_a20._28_4_ = local_a20._0_4_;
    auVar5 = vfmadd231ps_fma(auVar237,local_a20,_DAT_01faff20);
    auVar126 = vsubps_avx(auVar216,ZEXT1632(auVar5));
    fVar219 = auVar5._0_4_;
    fVar291 = auVar5._4_4_;
    fVar220 = auVar5._8_4_;
    fVar221 = auVar5._12_4_;
    fVar113 = auVar126._0_4_;
    fVar239 = auVar126._4_4_;
    fVar246 = auVar126._8_4_;
    fVar247 = auVar126._12_4_;
    fVar248 = auVar126._16_4_;
    fVar249 = auVar126._20_4_;
    fVar250 = auVar126._24_4_;
    auVar238._28_36_ = auVar208._28_36_;
    auVar238._0_28_ =
         ZEXT1628(CONCAT412(fVar221 * fVar221,
                            CONCAT48(fVar220 * fVar220,CONCAT44(fVar291 * fVar291,fVar219 * fVar219)
                                    )));
    fVar251 = fVar219 * 3.0;
    fVar264 = fVar291 * 3.0;
    fVar265 = fVar220 * 3.0;
    fVar266 = fVar221 * 3.0;
    fVar272 = auVar263._28_4_ + -5.0;
    auVar276._0_4_ = fVar113 * fVar113;
    auVar276._4_4_ = fVar239 * fVar239;
    auVar276._8_4_ = fVar246 * fVar246;
    auVar276._12_4_ = fVar247 * fVar247;
    auVar276._16_4_ = fVar248 * fVar248;
    auVar276._20_4_ = fVar249 * fVar249;
    auVar276._28_36_ = auVar275._28_36_;
    auVar276._24_4_ = fVar250 * fVar250;
    auVar275._0_4_ = (auVar276._0_4_ * (fVar113 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar275._4_4_ = (auVar276._4_4_ * (fVar239 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar275._8_4_ = (auVar276._8_4_ * (fVar246 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar275._12_4_ = (auVar276._12_4_ * (fVar247 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar275._16_4_ = (auVar276._16_4_ * (fVar248 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar275._20_4_ = (auVar276._20_4_ * (fVar249 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar275._28_36_ = auVar290._28_36_;
    auVar275._24_4_ = (auVar276._24_4_ * (fVar250 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar187 = auVar275._0_32_;
    fVar222 = fVar219 * fVar219 * -fVar113 * 0.5;
    fVar231 = fVar291 * fVar291 * -fVar239 * 0.5;
    fVar232 = fVar220 * fVar220 * -fVar246 * 0.5;
    fVar233 = fVar221 * fVar221 * -fVar247 * 0.5;
    fVar234 = -fVar248 * 0.0 * 0.0 * 0.5;
    fVar235 = -fVar249 * 0.0 * 0.0 * 0.5;
    fVar236 = -fVar250 * 0.0 * 0.0 * 0.5;
    auVar177._0_4_ = local_220 * fVar222;
    auVar177._4_4_ = fStack_21c * fVar231;
    auVar177._8_4_ = fStack_218 * fVar232;
    auVar177._12_4_ = fStack_214 * fVar233;
    auVar177._16_4_ = fStack_210 * fVar234;
    auVar177._20_4_ = fStack_20c * fVar235;
    auVar177._24_4_ = fStack_208 * fVar236;
    auVar177._28_4_ = 0;
    auVar19._4_4_ = fVar231 * local_580._4_4_;
    auVar19._0_4_ = fVar222 * (float)local_580;
    auVar19._8_4_ = fVar232 * (float)uStack_578;
    auVar19._12_4_ = fVar233 * uStack_578._4_4_;
    auVar19._16_4_ = fVar234 * (float)uStack_570;
    auVar19._20_4_ = fVar235 * uStack_570._4_4_;
    auVar19._24_4_ = fVar236 * (float)uStack_568;
    auVar19._28_4_ = auVar126._28_4_ ^ 0x80000000;
    auVar294._0_4_ = fVar222 * (float)local_5a0;
    auVar294._4_4_ = fVar231 * local_5a0._4_4_;
    auVar294._8_4_ = fVar232 * (float)uStack_598;
    auVar294._12_4_ = fVar233 * uStack_598._4_4_;
    auVar294._16_4_ = fVar234 * (float)uStack_590;
    auVar294._20_4_ = fVar235 * uStack_590._4_4_;
    auVar294._28_36_ = auVar293._28_36_;
    auVar294._24_4_ = fVar236 * (float)uStack_588;
    auVar20._4_4_ = fVar231 * local_5c0._4_4_;
    auVar20._0_4_ = fVar222 * (float)local_5c0;
    auVar20._8_4_ = fVar232 * (float)uStack_5b8;
    auVar20._12_4_ = fVar233 * uStack_5b8._4_4_;
    auVar20._16_4_ = fVar234 * (float)uStack_5b0;
    auVar20._20_4_ = fVar235 * uStack_5b0._4_4_;
    auVar20._24_4_ = fVar236 * (float)uStack_5a8;
    auVar20._28_4_ = 0x80000000;
    auVar73._4_4_ = uStack_61c;
    auVar73._0_4_ = local_620;
    auVar73._8_4_ = uStack_618;
    auVar73._12_4_ = uStack_614;
    auVar73._16_4_ = uStack_610;
    auVar73._20_4_ = uStack_60c;
    auVar73._24_4_ = uStack_608;
    auVar73._28_4_ = uStack_604;
    auVar5 = vfmadd231ps_fma(auVar177,auVar187,auVar73);
    auVar83._8_8_ = uStack_518;
    auVar83._0_8_ = local_520;
    auVar83._16_8_ = uStack_510;
    auVar83._24_8_ = uStack_508;
    auVar6 = vfmadd231ps_fma(auVar19,auVar187,auVar83);
    auVar81._8_8_ = uStack_538;
    auVar81._0_8_ = local_540;
    auVar81._16_8_ = uStack_530;
    auVar81._24_8_ = uStack_528;
    auVar296 = vfmadd231ps_fma(auVar294._0_32_,auVar187,auVar81);
    auVar79._8_8_ = uStack_558;
    auVar79._0_8_ = local_560;
    auVar79._16_8_ = uStack_550;
    auVar79._24_8_ = uStack_548;
    auVar114 = vfmadd231ps_fma(auVar20,auVar187,auVar79);
    auVar21._4_4_ = fVar239 * fVar239 * -fVar291 * 0.5;
    auVar21._0_4_ = fVar113 * fVar113 * -fVar219 * 0.5;
    auVar21._8_4_ = fVar246 * fVar246 * -fVar220 * 0.5;
    auVar21._12_4_ = fVar247 * fVar247 * -fVar221 * 0.5;
    auVar21._16_4_ = fVar248 * fVar248 * -0.0 * 0.5;
    auVar21._20_4_ = fVar249 * fVar249 * -0.0 * 0.5;
    auVar21._24_4_ = fVar250 * fVar250 * -0.0 * 0.5;
    auVar21._28_4_ = auVar281._28_4_;
    auVar22._4_4_ = ((fVar264 + -5.0) * fVar291 * fVar291 + 2.0) * 0.5;
    auVar22._0_4_ = ((fVar251 + -5.0) * fVar219 * fVar219 + 2.0) * 0.5;
    auVar22._8_4_ = ((fVar265 + -5.0) * fVar220 * fVar220 + 2.0) * 0.5;
    auVar22._12_4_ = ((fVar266 + -5.0) * fVar221 * fVar221 + 2.0) * 0.5;
    auVar22._16_4_ = 0x3f800000;
    auVar22._20_4_ = 0x3f800000;
    auVar22._24_4_ = 0x3f800000;
    auVar22._28_4_ = auVar290._28_4_ + 2.0;
    auVar75._4_4_ = uStack_5fc;
    auVar75._0_4_ = local_600;
    auVar75._8_4_ = uStack_5f8;
    auVar75._12_4_ = uStack_5f4;
    auVar75._16_4_ = uStack_5f0;
    auVar75._20_4_ = uStack_5ec;
    auVar75._24_4_ = uStack_5e8;
    auVar75._28_4_ = uStack_5e4;
    auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar22,auVar75);
    auVar89._8_8_ = uStack_4b8;
    auVar89._0_8_ = local_4c0;
    auVar89._16_8_ = uStack_4b0;
    auVar89._24_8_ = uStack_4a8;
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar22,auVar89);
    auVar87._8_8_ = uStack_4d8;
    auVar87._0_8_ = local_4e0;
    auVar87._16_8_ = uStack_4d0;
    auVar87._24_8_ = uStack_4c8;
    auVar296 = vfmadd231ps_fma(ZEXT1632(auVar296),auVar22,auVar87);
    auVar85._8_8_ = uStack_4f8;
    auVar85._0_8_ = local_500;
    auVar85._16_8_ = uStack_4f0;
    auVar85._24_8_ = uStack_4e8;
    auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar22,auVar85);
    auVar77._4_4_ = uStack_5dc;
    auVar77._0_4_ = local_5e0;
    auVar77._8_4_ = uStack_5d8;
    auVar77._12_4_ = uStack_5d4;
    auVar77._16_4_ = uStack_5d0;
    auVar77._20_4_ = uStack_5cc;
    auVar77._24_4_ = uStack_5c8;
    auVar77._28_4_ = uStack_5c4;
    auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar21,auVar77);
    auVar93._8_8_ = uStack_478;
    auVar93._0_8_ = local_480;
    auVar93._16_8_ = uStack_470;
    auVar93._24_8_ = uStack_468;
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar21,auVar93);
    auVar153 = ZEXT1632(auVar6);
    auVar91._8_8_ = uStack_498;
    auVar91._0_8_ = local_4a0;
    auVar91._16_8_ = uStack_490;
    auVar91._24_8_ = uStack_488;
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar296),auVar21,auVar91);
    auVar98._8_8_ = uStack_1d8;
    auVar98._0_8_ = local_1e0;
    auVar98._16_8_ = uStack_1d0;
    auVar98._24_8_ = uStack_1c8;
    auVar296 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar98,auVar21);
    auVar23._4_4_ = (fVar239 + fVar239) * fVar291;
    auVar23._0_4_ = (fVar113 + fVar113) * fVar219;
    auVar23._8_4_ = (fVar246 + fVar246) * fVar220;
    auVar23._12_4_ = (fVar247 + fVar247) * fVar221;
    auVar23._16_4_ = (fVar248 + fVar248) * 0.0;
    auVar23._20_4_ = (fVar249 + fVar249) * 0.0;
    auVar23._24_4_ = (fVar250 + fVar250) * 0.0;
    auVar23._28_4_ = 0;
    auVar187 = vsubps_avx(auVar23,auVar276._0_32_);
    fVar222 = auVar263._28_4_ + 2.0;
    auVar24._4_4_ = (fVar239 + fVar239) * (fVar264 + 2.0);
    auVar24._0_4_ = (fVar113 + fVar113) * (fVar251 + 2.0);
    auVar24._8_4_ = (fVar246 + fVar246) * (fVar265 + 2.0);
    auVar24._12_4_ = (fVar247 + fVar247) * (fVar266 + 2.0);
    auVar24._16_4_ = (fVar248 + fVar248) * 2.0;
    auVar24._20_4_ = (fVar249 + fVar249) * 2.0;
    auVar24._24_4_ = (fVar250 + fVar250) * 2.0;
    auVar24._28_4_ = fVar222;
    auVar25._4_4_ = fVar239 * 3.0 * fVar239;
    auVar25._0_4_ = fVar113 * 3.0 * fVar113;
    auVar25._8_4_ = fVar246 * 3.0 * fVar246;
    auVar25._12_4_ = fVar247 * 3.0 * fVar247;
    auVar25._16_4_ = fVar248 * 3.0 * fVar248;
    auVar25._20_4_ = fVar249 * 3.0 * fVar249;
    auVar25._24_4_ = fVar250 * 3.0 * fVar250;
    auVar25._28_4_ = auVar126._28_4_;
    auVar126 = vsubps_avx(auVar24,auVar25);
    auVar13 = vsubps_avx(auVar238._0_32_,auVar23);
    auVar26._4_4_ = auVar187._4_4_ * 0.5;
    auVar26._0_4_ = auVar187._0_4_ * 0.5;
    auVar26._8_4_ = auVar187._8_4_ * 0.5;
    auVar26._12_4_ = auVar187._12_4_ * 0.5;
    auVar26._16_4_ = auVar187._16_4_ * 0.5;
    auVar26._20_4_ = auVar187._20_4_ * 0.5;
    auVar26._24_4_ = auVar187._24_4_ * 0.5;
    auVar26._28_4_ = fVar222;
    auVar27._28_4_ = fVar272 + 0.0;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(((fVar221 + fVar221) * (fVar266 + -5.0) + fVar266 * fVar221) * 0.5,
                            CONCAT48(((fVar220 + fVar220) * (fVar265 + -5.0) + fVar265 * fVar220) *
                                     0.5,CONCAT44(((fVar291 + fVar291) * (fVar264 + -5.0) +
                                                  fVar264 * fVar291) * 0.5,
                                                  ((fVar219 + fVar219) * (fVar251 + -5.0) +
                                                  fVar251 * fVar219) * 0.5))));
    auVar28._4_4_ = auVar126._4_4_ * 0.5;
    auVar28._0_4_ = auVar126._0_4_ * 0.5;
    auVar28._8_4_ = auVar126._8_4_ * 0.5;
    auVar28._12_4_ = auVar126._12_4_ * 0.5;
    auVar28._16_4_ = auVar126._16_4_ * 0.5;
    auVar28._20_4_ = auVar126._20_4_ * 0.5;
    fVar113 = auVar126._28_4_;
    auVar28._24_4_ = auVar126._24_4_ * 0.5;
    auVar28._28_4_ = fVar113;
    fVar239 = auVar13._0_4_ * 0.5;
    fVar246 = auVar13._4_4_ * 0.5;
    fVar247 = auVar13._8_4_ * 0.5;
    fVar248 = auVar13._12_4_ * 0.5;
    fVar249 = auVar13._16_4_ * 0.5;
    fVar250 = auVar13._20_4_ * 0.5;
    fVar222 = auVar13._24_4_ * 0.5;
    auVar29._4_4_ = fStack_21c * fVar246;
    auVar29._0_4_ = local_220 * fVar239;
    auVar29._8_4_ = fStack_218 * fVar247;
    auVar29._12_4_ = fStack_214 * fVar248;
    auVar29._16_4_ = fStack_210 * fVar249;
    auVar29._20_4_ = fStack_20c * fVar250;
    auVar29._24_4_ = fStack_208 * fVar222;
    auVar29._28_4_ = auVar268._28_4_;
    auVar30._4_4_ = fVar246 * local_580._4_4_;
    auVar30._0_4_ = fVar239 * (float)local_580;
    auVar30._8_4_ = fVar247 * (float)uStack_578;
    auVar30._12_4_ = fVar248 * uStack_578._4_4_;
    auVar30._16_4_ = fVar249 * (float)uStack_570;
    auVar30._20_4_ = fVar250 * uStack_570._4_4_;
    auVar30._24_4_ = fVar222 * (float)uStack_568;
    auVar30._28_4_ = fVar272;
    auVar31._4_4_ = fVar246 * local_5a0._4_4_;
    auVar31._0_4_ = fVar239 * (float)local_5a0;
    auVar31._8_4_ = fVar247 * (float)uStack_598;
    auVar31._12_4_ = fVar248 * uStack_598._4_4_;
    auVar31._16_4_ = fVar249 * (float)uStack_590;
    auVar31._20_4_ = fVar250 * uStack_590._4_4_;
    auVar31._24_4_ = fVar222 * (float)uStack_588;
    auVar31._28_4_ = auVar187._28_4_;
    auVar32._4_4_ = fVar246 * local_5c0._4_4_;
    auVar32._0_4_ = fVar239 * (float)local_5c0;
    auVar32._8_4_ = fVar247 * (float)uStack_5b8;
    auVar32._12_4_ = fVar248 * uStack_5b8._4_4_;
    auVar32._16_4_ = fVar249 * (float)uStack_5b0;
    auVar32._20_4_ = fVar250 * uStack_5b0._4_4_;
    auVar32._24_4_ = fVar222 * (float)uStack_5a8;
    auVar32._28_4_ = auVar13._28_4_;
    auVar74._4_4_ = uStack_61c;
    auVar74._0_4_ = local_620;
    auVar74._8_4_ = uStack_618;
    auVar74._12_4_ = uStack_614;
    auVar74._16_4_ = uStack_610;
    auVar74._20_4_ = uStack_60c;
    auVar74._24_4_ = uStack_608;
    auVar74._28_4_ = uStack_604;
    auVar114 = vfmadd231ps_fma(auVar29,auVar28,auVar74);
    auVar84._8_8_ = uStack_518;
    auVar84._0_8_ = local_520;
    auVar84._16_8_ = uStack_510;
    auVar84._24_8_ = uStack_508;
    auVar173 = vfmadd231ps_fma(auVar30,auVar28,auVar84);
    auVar82._8_8_ = uStack_538;
    auVar82._0_8_ = local_540;
    auVar82._16_8_ = uStack_530;
    auVar82._24_8_ = uStack_528;
    auVar223 = vfmadd231ps_fma(auVar31,auVar28,auVar82);
    auVar80._8_8_ = uStack_558;
    auVar80._0_8_ = local_560;
    auVar80._16_8_ = uStack_550;
    auVar80._24_8_ = uStack_548;
    auVar122 = vfmadd231ps_fma(auVar32,auVar28,auVar80);
    auVar76._4_4_ = uStack_5fc;
    auVar76._0_4_ = local_600;
    auVar76._8_4_ = uStack_5f8;
    auVar76._12_4_ = uStack_5f4;
    auVar76._16_4_ = uStack_5f0;
    auVar76._20_4_ = uStack_5ec;
    auVar76._24_4_ = uStack_5e8;
    auVar76._28_4_ = uStack_5e4;
    auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar27,auVar76);
    auVar90._8_8_ = uStack_4b8;
    auVar90._0_8_ = local_4c0;
    auVar90._16_8_ = uStack_4b0;
    auVar90._24_8_ = uStack_4a8;
    auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),auVar27,auVar90);
    auVar88._8_8_ = uStack_4d8;
    auVar88._0_8_ = local_4e0;
    auVar88._16_8_ = uStack_4d0;
    auVar88._24_8_ = uStack_4c8;
    auVar223 = vfmadd231ps_fma(ZEXT1632(auVar223),auVar27,auVar88);
    auVar86._8_8_ = uStack_4f8;
    auVar86._0_8_ = local_500;
    auVar86._16_8_ = uStack_4f0;
    auVar86._24_8_ = uStack_4e8;
    auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar27,auVar86);
    auVar78._4_4_ = uStack_5dc;
    auVar78._0_4_ = local_5e0;
    auVar78._8_4_ = uStack_5d8;
    auVar78._12_4_ = uStack_5d4;
    auVar78._16_4_ = uStack_5d0;
    auVar78._20_4_ = uStack_5cc;
    auVar78._24_4_ = uStack_5c8;
    auVar78._28_4_ = uStack_5c4;
    auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar26,auVar78);
    auVar94._8_8_ = uStack_478;
    auVar94._0_8_ = local_480;
    auVar94._16_8_ = uStack_470;
    auVar94._24_8_ = uStack_468;
    auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),auVar26,auVar94);
    auVar92._8_8_ = uStack_498;
    auVar92._0_8_ = local_4a0;
    auVar92._16_8_ = uStack_490;
    auVar92._24_8_ = uStack_488;
    auVar223 = vfmadd231ps_fma(ZEXT1632(auVar223),auVar26,auVar92);
    auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar98,auVar26);
    local_820._0_4_ = auVar114._0_4_ * fVar209;
    local_820._4_4_ = auVar114._4_4_ * fVar209;
    local_820._8_4_ = auVar114._8_4_ * fVar209;
    local_820._12_4_ = auVar114._12_4_ * fVar209;
    local_820._16_4_ = fVar209 * 0.0;
    local_820._20_4_ = fVar209 * 0.0;
    local_820._24_4_ = fVar209 * 0.0;
    local_820._28_4_ = 0;
    fVar249 = auVar173._0_4_ * fVar209;
    fVar231 = auVar173._4_4_ * fVar209;
    auVar33._4_4_ = fVar231;
    auVar33._0_4_ = fVar249;
    fVar234 = auVar173._8_4_ * fVar209;
    auVar33._8_4_ = fVar234;
    fVar291 = auVar173._12_4_ * fVar209;
    auVar33._12_4_ = fVar291;
    auVar33._16_4_ = fVar209 * 0.0;
    auVar33._20_4_ = fVar209 * 0.0;
    auVar33._24_4_ = fVar209 * 0.0;
    auVar33._28_4_ = 0;
    fVar295 = auVar223._0_4_ * fVar209;
    fVar298 = auVar223._4_4_ * fVar209;
    auVar34._4_4_ = fVar298;
    auVar34._0_4_ = fVar295;
    fVar299 = auVar223._8_4_ * fVar209;
    auVar34._8_4_ = fVar299;
    fVar300 = auVar223._12_4_ * fVar209;
    auVar34._12_4_ = fVar300;
    fVar301 = fVar209 * 0.0;
    auVar34._16_4_ = fVar301;
    fVar302 = fVar209 * 0.0;
    auVar34._20_4_ = fVar302;
    fVar303 = fVar209 * 0.0;
    auVar34._24_4_ = fVar303;
    auVar34._28_4_ = 0x3f000000;
    fVar239 = fVar209 * auVar122._0_4_;
    fVar246 = fVar209 * auVar122._4_4_;
    auVar35._4_4_ = fVar246;
    auVar35._0_4_ = fVar239;
    fVar247 = fVar209 * auVar122._8_4_;
    auVar35._8_4_ = fVar247;
    fVar248 = fVar209 * auVar122._12_4_;
    auVar35._12_4_ = fVar248;
    auVar35._16_4_ = fVar209 * 0.0;
    auVar35._20_4_ = fVar209 * 0.0;
    auVar35._24_4_ = fVar209 * 0.0;
    auVar35._28_4_ = fVar113;
    auVar178 = ZEXT1632(auVar5);
    auVar152 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar5));
    _local_9c0 = vpermps_avx2(_DAT_01fec480,auVar153);
    auVar176 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar6));
    auVar15 = vsubps_avx(auVar152,auVar178);
    auVar134 = vsubps_avx(auVar176,ZEXT1632(auVar6));
    fVar250 = auVar134._0_4_;
    fVar222 = auVar134._4_4_;
    auVar36._4_4_ = fVar222 * local_820._4_4_;
    auVar36._0_4_ = fVar250 * local_820._0_4_;
    fVar232 = auVar134._8_4_;
    auVar36._8_4_ = fVar232 * local_820._8_4_;
    fVar233 = auVar134._12_4_;
    auVar36._12_4_ = fVar233 * local_820._12_4_;
    fVar235 = auVar134._16_4_;
    auVar36._16_4_ = fVar235 * local_820._16_4_;
    fVar236 = auVar134._20_4_;
    auVar36._20_4_ = fVar236 * local_820._20_4_;
    fVar219 = auVar134._24_4_;
    auVar36._24_4_ = fVar219 * local_820._24_4_;
    auVar36._28_4_ = auVar176._28_4_;
    auVar5 = vfmsub231ps_fma(auVar36,auVar34,auVar15);
    auVar16 = vsubps_avx(_local_9c0,auVar153);
    fVar265 = auVar15._0_4_;
    fVar266 = auVar15._4_4_;
    auVar37._4_4_ = fVar266 * fVar231;
    auVar37._0_4_ = fVar265 * fVar249;
    fVar272 = auVar15._8_4_;
    auVar37._8_4_ = fVar272 * fVar234;
    fVar282 = auVar15._12_4_;
    auVar37._12_4_ = fVar282 * fVar291;
    fVar283 = auVar15._16_4_;
    auVar37._16_4_ = fVar283 * fVar209 * 0.0;
    fVar284 = auVar15._20_4_;
    auVar37._20_4_ = fVar284 * fVar209 * 0.0;
    fVar285 = auVar15._24_4_;
    auVar37._24_4_ = fVar285 * fVar209 * 0.0;
    auVar37._28_4_ = local_9c0._28_4_;
    auVar114 = vfmsub231ps_fma(auVar37,local_820,auVar16);
    auVar5 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar114._12_4_ * auVar114._12_4_,
                                                CONCAT48(auVar114._8_4_ * auVar114._8_4_,
                                                         CONCAT44(auVar114._4_4_ * auVar114._4_4_,
                                                                  auVar114._0_4_ * auVar114._0_4_)))
                                     ),ZEXT1632(auVar5),ZEXT1632(auVar5));
    fVar231 = auVar16._0_4_;
    fVar234 = auVar16._4_4_;
    auVar38._4_4_ = fVar234 * fVar298;
    auVar38._0_4_ = fVar231 * fVar295;
    fVar291 = auVar16._8_4_;
    auVar38._8_4_ = fVar291 * fVar299;
    fVar220 = auVar16._12_4_;
    auVar38._12_4_ = fVar220 * fVar300;
    fVar221 = auVar16._16_4_;
    auVar38._16_4_ = fVar221 * fVar301;
    fVar251 = auVar16._20_4_;
    auVar38._20_4_ = fVar251 * fVar302;
    fVar264 = auVar16._24_4_;
    auVar38._24_4_ = fVar264 * fVar303;
    auVar38._28_4_ = 0;
    auVar173 = vfmsub231ps_fma(auVar38,auVar33,auVar134);
    auVar203._0_4_ = fVar250 * fVar250;
    auVar203._4_4_ = fVar222 * fVar222;
    auVar203._8_4_ = fVar232 * fVar232;
    auVar203._12_4_ = fVar233 * fVar233;
    auVar203._16_4_ = fVar235 * fVar235;
    auVar203._20_4_ = fVar236 * fVar236;
    auVar203._24_4_ = fVar219 * fVar219;
    auVar203._28_4_ = 0;
    auVar114 = vfmadd231ps_fma(auVar203,auVar16,auVar16);
    auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar15,auVar15);
    auVar126 = vrcpps_avx(ZEXT1632(auVar114));
    auVar173 = vfmadd231ps_fma(ZEXT1632(auVar5),ZEXT1632(auVar173),ZEXT1632(auVar173));
    auVar179._8_4_ = 0x3f800000;
    auVar179._0_8_ = 0x3f8000003f800000;
    auVar179._12_4_ = 0x3f800000;
    auVar179._16_4_ = 0x3f800000;
    auVar179._20_4_ = 0x3f800000;
    auVar179._24_4_ = 0x3f800000;
    auVar179._28_4_ = 0x3f800000;
    auVar5 = vfnmadd213ps_fma(auVar126,ZEXT1632(auVar114),auVar179);
    auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar126,auVar126);
    _local_a40 = vpermps_avx2(_DAT_01fec480,local_820);
    local_8a0 = vpermps_avx2(_DAT_01fec480,auVar34);
    auVar39._4_4_ = fVar222 * local_a40._4_4_;
    auVar39._0_4_ = fVar250 * local_a40._0_4_;
    auVar39._8_4_ = fVar232 * local_a40._8_4_;
    auVar39._12_4_ = fVar233 * local_a40._12_4_;
    auVar39._16_4_ = fVar235 * local_a40._16_4_;
    auVar39._20_4_ = fVar236 * local_a40._20_4_;
    auVar39._24_4_ = fVar219 * local_a40._24_4_;
    auVar39._28_4_ = auVar126._28_4_;
    auVar223 = vfmsub231ps_fma(auVar39,local_8a0,auVar15);
    local_a00 = vpermps_avx2(_DAT_01fec480,auVar33);
    auVar40._4_4_ = fVar266 * local_a00._4_4_;
    auVar40._0_4_ = fVar265 * local_a00._0_4_;
    auVar40._8_4_ = fVar272 * local_a00._8_4_;
    auVar40._12_4_ = fVar282 * local_a00._12_4_;
    auVar40._16_4_ = fVar283 * local_a00._16_4_;
    auVar40._20_4_ = fVar284 * local_a00._20_4_;
    auVar40._24_4_ = fVar285 * local_a00._24_4_;
    auVar40._28_4_ = 0;
    auVar122 = vfmsub231ps_fma(auVar40,_local_a40,auVar16);
    auVar223 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar122._12_4_ * auVar122._12_4_,
                                                  CONCAT48(auVar122._8_4_ * auVar122._8_4_,
                                                           CONCAT44(auVar122._4_4_ * auVar122._4_4_,
                                                                    auVar122._0_4_ * auVar122._0_4_)
                                                          ))),ZEXT1632(auVar223),ZEXT1632(auVar223))
    ;
    auVar252._0_4_ = fVar231 * local_8a0._0_4_;
    auVar252._4_4_ = fVar234 * local_8a0._4_4_;
    auVar252._8_4_ = fVar291 * local_8a0._8_4_;
    auVar252._12_4_ = fVar220 * local_8a0._12_4_;
    auVar252._16_4_ = fVar221 * local_8a0._16_4_;
    auVar252._20_4_ = fVar251 * local_8a0._20_4_;
    auVar252._24_4_ = fVar264 * local_8a0._24_4_;
    auVar252._28_4_ = 0;
    auVar122 = vfmsub231ps_fma(auVar252,local_a00,auVar134);
    auVar223 = vfmadd231ps_fma(ZEXT1632(auVar223),ZEXT1632(auVar122),ZEXT1632(auVar122));
    auVar126 = vmaxps_avx(ZEXT1632(CONCAT412(auVar173._12_4_ * auVar5._12_4_,
                                             CONCAT48(auVar173._8_4_ * auVar5._8_4_,
                                                      CONCAT44(auVar173._4_4_ * auVar5._4_4_,
                                                               auVar173._0_4_ * auVar5._0_4_)))),
                          ZEXT1632(CONCAT412(auVar223._12_4_ * auVar5._12_4_,
                                             CONCAT48(auVar223._8_4_ * auVar5._8_4_,
                                                      CONCAT44(auVar223._4_4_ * auVar5._4_4_,
                                                               auVar223._0_4_ * auVar5._0_4_)))));
    local_960._0_4_ = auVar296._0_4_ + fVar239;
    local_960._4_4_ = auVar296._4_4_ + fVar246;
    local_960._8_4_ = auVar296._8_4_ + fVar247;
    local_960._12_4_ = auVar296._12_4_ + fVar248;
    local_960._16_4_ = fVar209 * 0.0 + 0.0;
    local_960._20_4_ = fVar209 * 0.0 + 0.0;
    local_960._24_4_ = fVar209 * 0.0 + 0.0;
    local_960._28_4_ = fVar113 + 0.0;
    auVar227 = ZEXT1632(auVar296);
    auVar187 = vsubps_avx(auVar227,auVar35);
    local_840 = vpermps_avx2(_DAT_01fec480,auVar187);
    auVar226 = vpermps_avx2(_DAT_01fec480,auVar227);
    auVar187 = vmaxps_avx(auVar227,local_960);
    auVar13 = vmaxps_avx(local_840,auVar226);
    auVar14 = vrsqrtps_avx(ZEXT1632(auVar114));
    auVar187 = vmaxps_avx(auVar187,auVar13);
    fVar209 = auVar14._0_4_;
    fVar113 = auVar14._4_4_;
    fVar239 = auVar14._8_4_;
    fVar246 = auVar14._12_4_;
    fVar247 = auVar14._16_4_;
    fVar248 = auVar14._20_4_;
    fVar249 = auVar14._24_4_;
    auVar41._4_4_ = fVar113 * fVar113 * fVar113 * auVar114._4_4_ * -0.5;
    auVar41._0_4_ = fVar209 * fVar209 * fVar209 * auVar114._0_4_ * -0.5;
    auVar41._8_4_ = fVar239 * fVar239 * fVar239 * auVar114._8_4_ * -0.5;
    auVar41._12_4_ = fVar246 * fVar246 * fVar246 * auVar114._12_4_ * -0.5;
    auVar41._16_4_ = fVar247 * fVar247 * fVar247 * -0.0;
    auVar41._20_4_ = fVar248 * fVar248 * fVar248 * -0.0;
    auVar41._24_4_ = fVar249 * fVar249 * fVar249 * -0.0;
    auVar41._28_4_ = local_960._28_4_;
    auVar128._8_4_ = 0x3fc00000;
    auVar128._0_8_ = 0x3fc000003fc00000;
    auVar128._12_4_ = 0x3fc00000;
    auVar128._16_4_ = 0x3fc00000;
    auVar128._20_4_ = 0x3fc00000;
    auVar128._24_4_ = 0x3fc00000;
    auVar128._28_4_ = 0x3fc00000;
    auVar5 = vfmadd231ps_fma(auVar41,auVar128,auVar14);
    fVar113 = auVar5._0_4_;
    fVar246 = auVar5._4_4_;
    auVar42._4_4_ = fVar234 * fVar246;
    auVar42._0_4_ = fVar231 * fVar113;
    fVar249 = auVar5._8_4_;
    auVar42._8_4_ = fVar291 * fVar249;
    fVar231 = auVar5._12_4_;
    auVar42._12_4_ = fVar220 * fVar231;
    auVar42._16_4_ = fVar221 * 0.0;
    auVar42._20_4_ = fVar251 * 0.0;
    auVar42._24_4_ = fVar264 * 0.0;
    auVar42._28_4_ = 0;
    auVar43._4_4_ = fVar111 * fVar222 * fVar246;
    auVar43._0_4_ = fVar111 * fVar250 * fVar113;
    auVar43._8_4_ = fVar111 * fVar232 * fVar249;
    auVar43._12_4_ = fVar111 * fVar233 * fVar231;
    auVar43._16_4_ = fVar111 * fVar235 * 0.0;
    auVar43._20_4_ = fVar111 * fVar236 * 0.0;
    auVar43._24_4_ = fVar111 * fVar219 * 0.0;
    auVar43._28_4_ = auVar16._28_4_;
    auVar296 = vfmadd231ps_fma(auVar43,auVar42,_local_a60);
    auVar292 = ZEXT1632(auVar6);
    auVar129 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar13 = vsubps_avx(auVar129,auVar292);
    fVar239 = auVar13._0_4_;
    fVar247 = auVar13._4_4_;
    auVar44._4_4_ = fVar222 * fVar246 * fVar247;
    auVar44._0_4_ = fVar250 * fVar113 * fVar239;
    fVar250 = auVar13._8_4_;
    auVar44._8_4_ = fVar232 * fVar249 * fVar250;
    fVar232 = auVar13._12_4_;
    auVar44._12_4_ = fVar233 * fVar231 * fVar232;
    fVar234 = auVar13._16_4_;
    auVar44._16_4_ = fVar235 * 0.0 * fVar234;
    fVar235 = auVar13._20_4_;
    auVar44._20_4_ = fVar236 * 0.0 * fVar235;
    fVar236 = auVar13._24_4_;
    auVar44._24_4_ = fVar219 * 0.0 * fVar236;
    auVar44._28_4_ = local_8a0._28_4_;
    auVar129 = vsubps_avx(auVar129,auVar153);
    auVar6 = vfmadd231ps_fma(auVar44,auVar129,auVar42);
    auVar45._4_4_ = fVar266 * fVar246;
    auVar45._0_4_ = fVar265 * fVar113;
    auVar45._8_4_ = fVar272 * fVar249;
    auVar45._12_4_ = fVar282 * fVar231;
    auVar45._16_4_ = fVar283 * 0.0;
    auVar45._20_4_ = fVar284 * 0.0;
    auVar45._24_4_ = fVar285 * 0.0;
    auVar45._28_4_ = 0;
    auVar296 = vfmadd231ps_fma(ZEXT1632(auVar296),auVar45,_local_860);
    auVar275 = ZEXT1664(auVar296);
    auVar130 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar259 = vsubps_avx(auVar130,auVar178);
    auVar281 = ZEXT3264(auVar259);
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar259,auVar45);
    auVar46._4_4_ = fVar111 * fVar247;
    auVar46._0_4_ = fVar111 * fVar239;
    auVar46._8_4_ = fVar111 * fVar250;
    auVar46._12_4_ = fVar111 * fVar232;
    auVar46._16_4_ = fVar111 * fVar234;
    auVar46._20_4_ = fVar111 * fVar235;
    auVar46._24_4_ = fVar111 * fVar236;
    auVar46._28_4_ = 0;
    auVar114 = vfmadd231ps_fma(auVar46,_local_a60,auVar129);
    auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),_local_860,auVar259);
    fVar209 = auVar6._0_4_;
    fVar251 = auVar296._0_4_;
    fVar248 = auVar6._4_4_;
    fVar264 = auVar296._4_4_;
    fVar222 = auVar6._8_4_;
    fVar265 = auVar296._8_4_;
    fVar233 = auVar6._12_4_;
    fVar266 = auVar296._12_4_;
    auVar47._28_4_ = auVar14._28_4_;
    auVar47._0_28_ =
         ZEXT1628(CONCAT412(fVar266 * fVar233,
                            CONCAT48(fVar265 * fVar222,CONCAT44(fVar264 * fVar248,fVar251 * fVar209)
                                    )));
    auVar12 = vsubps_avx(ZEXT1632(auVar114),auVar47);
    auVar48._4_4_ = fVar247 * fVar247;
    auVar48._0_4_ = fVar239 * fVar239;
    auVar48._8_4_ = fVar250 * fVar250;
    auVar48._12_4_ = fVar232 * fVar232;
    auVar48._16_4_ = fVar234 * fVar234;
    auVar48._20_4_ = fVar235 * fVar235;
    auVar48._24_4_ = fVar236 * fVar236;
    auVar48._28_4_ = auVar14._28_4_;
    auVar114 = vfmadd231ps_fma(auVar48,auVar129,auVar129);
    auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar259,auVar259);
    auVar14 = vsubps_avx(ZEXT1632(auVar114),
                         ZEXT1632(CONCAT412(fVar233 * fVar233,
                                            CONCAT48(fVar222 * fVar222,
                                                     CONCAT44(fVar248 * fVar248,fVar209 * fVar209)))
                                 ));
    auVar13 = vsqrtps_avx(auVar126);
    fVar221 = auVar13._28_4_ + auVar187._28_4_;
    fVar209 = (auVar13._0_4_ + auVar187._0_4_) * 1.0000002;
    fVar248 = (auVar13._4_4_ + auVar187._4_4_) * 1.0000002;
    fVar222 = (auVar13._8_4_ + auVar187._8_4_) * 1.0000002;
    fVar233 = (auVar13._12_4_ + auVar187._12_4_) * 1.0000002;
    fVar219 = (auVar13._16_4_ + auVar187._16_4_) * 1.0000002;
    fVar291 = (auVar13._20_4_ + auVar187._20_4_) * 1.0000002;
    fVar220 = (auVar13._24_4_ + auVar187._24_4_) * 1.0000002;
    auVar49._4_4_ = fVar248 * fVar248;
    auVar49._0_4_ = fVar209 * fVar209;
    auVar49._8_4_ = fVar222 * fVar222;
    auVar49._12_4_ = fVar233 * fVar233;
    auVar49._16_4_ = fVar219 * fVar219;
    auVar49._20_4_ = fVar291 * fVar291;
    auVar49._24_4_ = fVar220 * fVar220;
    auVar49._28_4_ = fVar221;
    fVar248 = auVar12._0_4_ + auVar12._0_4_;
    fVar222 = auVar12._4_4_ + auVar12._4_4_;
    auVar253._0_8_ = CONCAT44(fVar222,fVar248);
    auVar253._8_4_ = auVar12._8_4_ + auVar12._8_4_;
    auVar253._12_4_ = auVar12._12_4_ + auVar12._12_4_;
    auVar253._16_4_ = auVar12._16_4_ + auVar12._16_4_;
    auVar253._20_4_ = auVar12._20_4_ + auVar12._20_4_;
    auVar253._24_4_ = auVar12._24_4_ + auVar12._24_4_;
    fVar209 = auVar12._28_4_;
    auVar253._28_4_ = fVar209 + fVar209;
    auVar187 = vsubps_avx(auVar14,auVar49);
    auVar274 = ZEXT1632(auVar296);
    auVar50._28_4_ = fVar221;
    auVar50._0_28_ =
         ZEXT1628(CONCAT412(fVar266 * fVar266,
                            CONCAT48(fVar265 * fVar265,CONCAT44(fVar264 * fVar264,fVar251 * fVar251)
                                    )));
    local_6a0 = vsubps_avx(local_200,auVar50);
    auVar268 = ZEXT3264(local_6a0);
    auVar51._4_4_ = fVar222 * fVar222;
    auVar51._0_4_ = fVar248 * fVar248;
    auVar51._8_4_ = auVar253._8_4_ * auVar253._8_4_;
    auVar51._12_4_ = auVar253._12_4_ * auVar253._12_4_;
    auVar51._16_4_ = auVar253._16_4_ * auVar253._16_4_;
    auVar51._20_4_ = auVar253._20_4_ * auVar253._20_4_;
    auVar51._24_4_ = auVar253._24_4_ * auVar253._24_4_;
    auVar51._28_4_ = 0;
    fVar233 = local_6a0._0_4_;
    fVar219 = local_6a0._4_4_;
    fVar291 = local_6a0._8_4_;
    fVar220 = local_6a0._12_4_;
    fVar221 = local_6a0._16_4_;
    fVar251 = local_6a0._20_4_;
    fVar264 = local_6a0._24_4_;
    auVar52._4_4_ = fVar219 * 4.0 * auVar187._4_4_;
    auVar52._0_4_ = fVar233 * 4.0 * auVar187._0_4_;
    auVar52._8_4_ = fVar291 * 4.0 * auVar187._8_4_;
    auVar52._12_4_ = fVar220 * 4.0 * auVar187._12_4_;
    auVar52._16_4_ = fVar221 * 4.0 * auVar187._16_4_;
    auVar52._20_4_ = fVar251 * 4.0 * auVar187._20_4_;
    auVar52._24_4_ = fVar264 * 4.0 * auVar187._24_4_;
    auVar52._28_4_ = fVar209;
    auVar12 = vsubps_avx(auVar51,auVar52);
    auVar126 = vcmpps_avx(auVar12,auVar130,5);
    auVar293 = ZEXT3264(auVar126);
    auVar297 = ZEXT1632(auVar6);
    fVar209 = local_6a0._28_4_;
    if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar126 >> 0x7f,0) == '\0') &&
          (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar126 >> 0xbf,0) == '\0') &&
        (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar126[0x1f])
    {
      auVar228._8_4_ = 0x7f800000;
      auVar228._0_8_ = 0x7f8000007f800000;
      auVar228._12_4_ = 0x7f800000;
      auVar228._16_4_ = 0x7f800000;
      auVar228._20_4_ = 0x7f800000;
      auVar228._24_4_ = 0x7f800000;
      auVar228._28_4_ = 0x7f800000;
      auVar204._8_4_ = 0xff800000;
      auVar204._0_8_ = 0xff800000ff800000;
      auVar204._12_4_ = 0xff800000;
      auVar204._16_4_ = 0xff800000;
      auVar204._20_4_ = 0xff800000;
      auVar204._24_4_ = 0xff800000;
      auVar204._28_4_ = 0xff800000;
    }
    else {
      auVar127 = vsqrtps_avx(auVar12);
      auVar286._0_4_ = fVar233 + fVar233;
      auVar286._4_4_ = fVar219 + fVar219;
      auVar286._8_4_ = fVar291 + fVar291;
      auVar286._12_4_ = fVar220 + fVar220;
      auVar286._16_4_ = fVar221 + fVar221;
      auVar286._20_4_ = fVar251 + fVar251;
      auVar286._24_4_ = fVar264 + fVar264;
      auVar286._28_4_ = fVar209 + fVar209;
      auVar243 = vrcpps_avx(auVar286);
      auVar130 = vcmpps_avx(auVar12,auVar130,5);
      auVar131._8_4_ = 0x3f800000;
      auVar131._0_8_ = 0x3f8000003f800000;
      auVar131._12_4_ = 0x3f800000;
      auVar131._16_4_ = 0x3f800000;
      auVar131._20_4_ = 0x3f800000;
      auVar131._24_4_ = 0x3f800000;
      auVar131._28_4_ = 0x3f800000;
      auVar6 = vfnmadd213ps_fma(auVar286,auVar243,auVar131);
      auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar243,auVar243);
      auVar205._0_8_ = CONCAT44(fVar222,fVar248) ^ 0x8000000080000000;
      auVar205._8_4_ = -auVar253._8_4_;
      auVar205._12_4_ = -auVar253._12_4_;
      auVar205._16_4_ = -auVar253._16_4_;
      auVar205._20_4_ = -auVar253._20_4_;
      auVar205._24_4_ = -auVar253._24_4_;
      auVar205._28_4_ = -auVar253._28_4_;
      auVar12 = vsubps_avx(auVar205,auVar127);
      auVar53._4_4_ = auVar6._4_4_ * auVar12._4_4_;
      auVar53._0_4_ = auVar6._0_4_ * auVar12._0_4_;
      auVar53._8_4_ = auVar6._8_4_ * auVar12._8_4_;
      auVar53._12_4_ = auVar6._12_4_ * auVar12._12_4_;
      auVar53._16_4_ = auVar12._16_4_ * 0.0;
      auVar53._20_4_ = auVar12._20_4_ * 0.0;
      auVar53._24_4_ = auVar12._24_4_ * 0.0;
      auVar53._28_4_ = auVar12._28_4_;
      auVar12 = vsubps_avx(auVar127,auVar253);
      auVar54._4_4_ = auVar6._4_4_ * auVar12._4_4_;
      auVar54._0_4_ = auVar6._0_4_ * auVar12._0_4_;
      auVar54._8_4_ = auVar6._8_4_ * auVar12._8_4_;
      auVar54._12_4_ = auVar6._12_4_ * auVar12._12_4_;
      auVar54._16_4_ = auVar12._16_4_ * 0.0;
      auVar54._20_4_ = auVar12._20_4_ * 0.0;
      auVar54._24_4_ = auVar12._24_4_ * 0.0;
      auVar54._28_4_ = auVar12._28_4_;
      auVar6 = vfmadd213ps_fma(auVar274,auVar53,auVar297);
      local_280 = auVar6._0_4_ * fVar113;
      fStack_27c = auVar6._4_4_ * fVar246;
      fStack_278 = auVar6._8_4_ * fVar249;
      fStack_274 = auVar6._12_4_ * fVar231;
      uStack_270 = 0;
      uStack_26c = 0;
      uStack_268 = 0;
      uStack_264 = 0x3f800000;
      auVar12 = vandps_avx(local_8c0,auVar50);
      auVar12 = vmaxps_avx(local_640,auVar12);
      auVar55._4_4_ = auVar12._4_4_ * 1.9073486e-06;
      auVar55._0_4_ = auVar12._0_4_ * 1.9073486e-06;
      auVar55._8_4_ = auVar12._8_4_ * 1.9073486e-06;
      auVar55._12_4_ = auVar12._12_4_ * 1.9073486e-06;
      auVar55._16_4_ = auVar12._16_4_ * 1.9073486e-06;
      auVar55._20_4_ = auVar12._20_4_ * 1.9073486e-06;
      auVar55._24_4_ = auVar12._24_4_ * 1.9073486e-06;
      auVar55._28_4_ = auVar12._28_4_;
      auVar12 = vandps_avx(local_6a0,local_8c0);
      auVar12 = vcmpps_avx(auVar12,auVar55,1);
      auVar6 = vfmadd213ps_fma(auVar274,auVar54,auVar297);
      auVar132._8_4_ = 0x7f800000;
      auVar132._0_8_ = 0x7f8000007f800000;
      auVar132._12_4_ = 0x7f800000;
      auVar132._16_4_ = 0x7f800000;
      auVar132._20_4_ = 0x7f800000;
      auVar132._24_4_ = 0x7f800000;
      auVar132._28_4_ = 0x7f800000;
      auVar228 = vblendvps_avx(auVar132,auVar53,auVar130);
      local_2c0 = auVar6._0_4_ * fVar113;
      fStack_2bc = auVar6._4_4_ * fVar246;
      fStack_2b8 = auVar6._8_4_ * fVar249;
      fStack_2b4 = auVar6._12_4_ * fVar231;
      uStack_2b0 = 0;
      uStack_2ac = 0;
      uStack_2a8 = 0;
      uStack_2a4 = 0x7f800000;
      auVar133._8_4_ = 0xff800000;
      auVar133._0_8_ = 0xff800000ff800000;
      auVar133._12_4_ = 0xff800000;
      auVar133._16_4_ = 0xff800000;
      auVar133._20_4_ = 0xff800000;
      auVar133._24_4_ = 0xff800000;
      auVar133._28_4_ = 0xff800000;
      auVar204 = vblendvps_avx(auVar133,auVar54,auVar130);
      auVar243 = auVar130 & auVar12;
      if ((((((((auVar243 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar243 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar243 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar243 >> 0x7f,0) == '\0') &&
            (auVar243 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar243 >> 0xbf,0) == '\0') &&
          (auVar243 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar243[0x1f]) {
        auVar293 = ZEXT3264(auVar126);
      }
      else {
        auVar126 = vandps_avx(auVar12,auVar130);
        auVar12 = vcmpps_avx(auVar187,_DAT_01faff00,2);
        auVar141._8_4_ = 0xff800000;
        auVar141._0_8_ = 0xff800000ff800000;
        auVar141._12_4_ = 0xff800000;
        auVar141._16_4_ = 0xff800000;
        auVar141._20_4_ = 0xff800000;
        auVar141._24_4_ = 0xff800000;
        auVar141._28_4_ = 0xff800000;
        auVar161._8_4_ = 0x7f800000;
        auVar161._0_8_ = 0x7f8000007f800000;
        auVar161._12_4_ = 0x7f800000;
        auVar161._16_4_ = 0x7f800000;
        auVar161._20_4_ = 0x7f800000;
        auVar161._24_4_ = 0x7f800000;
        auVar161._28_4_ = 0x7f800000;
        auVar187 = vblendvps_avx(auVar161,auVar141,auVar12);
        auVar6 = vpackssdw_avx(auVar126._0_16_,auVar126._16_16_);
        auVar243 = vpmovsxwd_avx2(auVar6);
        auVar228 = vblendvps_avx(auVar228,auVar187,auVar243);
        auVar187 = vblendvps_avx(auVar141,auVar161,auVar12);
        auVar204 = vblendvps_avx(auVar204,auVar187,auVar243);
        auVar218._0_8_ = auVar126._0_8_ ^ 0xffffffffffffffff;
        auVar218._8_4_ = auVar126._8_4_ ^ 0xffffffff;
        auVar218._12_4_ = auVar126._12_4_ ^ 0xffffffff;
        auVar218._16_4_ = auVar126._16_4_ ^ 0xffffffff;
        auVar218._20_4_ = auVar126._20_4_ ^ 0xffffffff;
        auVar218._24_4_ = auVar126._24_4_ ^ 0xffffffff;
        auVar218._28_4_ = auVar126._28_4_ ^ 0xffffffff;
        auVar126 = vorps_avx(auVar12,auVar218);
        auVar126 = vandps_avx(auVar130,auVar126);
        auVar293 = ZEXT3264(auVar126);
      }
    }
    auVar290 = ZEXT3264(auVar271);
    auVar263 = ZEXT3264(auVar253);
    auVar187 = auVar293._0_32_;
    auVar126 = local_7e0 & auVar187;
    if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar126 >> 0x7f,0) != '\0') ||
          (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar126 >> 0xbf,0) != '\0') ||
        (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar126[0x1f] < '\0') {
      local_2a0 = ZEXT1632(auVar5);
      fVar248 = *(float *)(ray + k * 4 + 0x100);
      local_6e0 = ZEXT416((uint)fVar248);
      fVar222 = fVar248 - (float)local_920._0_4_;
      auVar217._4_4_ = fVar222;
      auVar217._0_4_ = fVar222;
      auVar217._8_4_ = fVar222;
      auVar217._12_4_ = fVar222;
      auVar217._16_4_ = fVar222;
      auVar217._20_4_ = fVar222;
      auVar217._24_4_ = fVar222;
      auVar217._28_4_ = fVar222;
      auVar130 = vminps_avx(auVar217,auVar204);
      auVar56._4_4_ = fVar247 * fVar298;
      auVar56._0_4_ = fVar239 * fVar295;
      auVar56._8_4_ = fVar250 * fVar299;
      auVar56._12_4_ = fVar232 * fVar300;
      auVar56._16_4_ = fVar234 * fVar301;
      auVar56._20_4_ = fVar235 * fVar302;
      auVar56._24_4_ = fVar236 * fVar303;
      auVar56._28_4_ = fVar222;
      auVar5 = vfmadd213ps_fma(auVar129,auVar33,auVar56);
      auVar97._4_4_ = fStack_23c;
      auVar97._0_4_ = local_240;
      auVar97._8_4_ = fStack_238;
      auVar97._12_4_ = fStack_234;
      auVar97._16_4_ = fStack_230;
      auVar97._20_4_ = fStack_22c;
      auVar97._24_4_ = fStack_228;
      auVar97._28_4_ = fStack_224;
      auVar12 = vmaxps_avx(auVar97,auVar228);
      auVar6 = vfmadd213ps_fma(auVar259,local_820,ZEXT1632(auVar5));
      auVar57._4_4_ = fVar111 * fVar298;
      auVar57._0_4_ = fVar111 * fVar295;
      auVar57._8_4_ = fVar111 * fVar299;
      auVar57._12_4_ = fVar111 * fVar300;
      auVar57._16_4_ = fVar111 * fVar301;
      auVar57._20_4_ = fVar111 * fVar302;
      auVar57._24_4_ = fVar111 * fVar303;
      auVar57._28_4_ = 0x3f000000;
      auVar5 = vfmadd231ps_fma(auVar57,_local_a60,auVar33);
      auVar296 = vfmadd231ps_fma(ZEXT1632(auVar5),_local_860,local_820);
      auVar268 = ZEXT3264(auVar187);
      auVar293 = ZEXT3264(local_8c0);
      auVar126 = vandps_avx(local_8c0,ZEXT1632(auVar296));
      auVar254._8_4_ = 0x219392ef;
      auVar254._0_8_ = 0x219392ef219392ef;
      auVar254._12_4_ = 0x219392ef;
      auVar254._16_4_ = 0x219392ef;
      auVar254._20_4_ = 0x219392ef;
      auVar254._24_4_ = 0x219392ef;
      auVar254._28_4_ = 0x219392ef;
      auVar129 = vcmpps_avx(auVar126,auVar254,1);
      auVar126 = vrcpps_avx(ZEXT1632(auVar296));
      auVar229._8_4_ = 0x3f800000;
      auVar229._0_8_ = 0x3f8000003f800000;
      auVar229._12_4_ = 0x3f800000;
      auVar229._16_4_ = 0x3f800000;
      auVar229._20_4_ = 0x3f800000;
      auVar229._24_4_ = 0x3f800000;
      auVar229._28_4_ = 0x3f800000;
      auVar243 = ZEXT1632(auVar296);
      auVar5 = vfnmadd213ps_fma(auVar126,auVar243,auVar229);
      auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar126,auVar126);
      auVar287._0_8_ = auVar296._0_8_ ^ 0x8000000080000000;
      auVar287._8_4_ = auVar296._8_4_ ^ 0x80000000;
      auVar287._12_4_ = auVar296._12_4_ ^ 0x80000000;
      auVar287._16_4_ = 0x80000000;
      auVar287._20_4_ = 0x80000000;
      auVar287._24_4_ = 0x80000000;
      auVar287._28_4_ = 0x80000000;
      auVar58._4_4_ = auVar5._4_4_ * -auVar6._4_4_;
      auVar58._0_4_ = auVar5._0_4_ * -auVar6._0_4_;
      auVar58._8_4_ = auVar5._8_4_ * -auVar6._8_4_;
      auVar58._12_4_ = auVar5._12_4_ * -auVar6._12_4_;
      auVar58._16_4_ = 0x80000000;
      auVar58._20_4_ = 0x80000000;
      auVar58._24_4_ = 0x80000000;
      auVar58._28_4_ = 0x80000000;
      auVar126 = vcmpps_avx(auVar243,auVar287,1);
      auVar126 = vorps_avx(auVar129,auVar126);
      auVar278._8_4_ = 0xff800000;
      auVar278._0_8_ = 0xff800000ff800000;
      auVar278._12_4_ = 0xff800000;
      auVar278._16_4_ = 0xff800000;
      auVar278._20_4_ = 0xff800000;
      auVar278._24_4_ = 0xff800000;
      auVar278._28_4_ = 0xff800000;
      auVar126 = vblendvps_avx(auVar58,auVar278,auVar126);
      auVar259 = vmaxps_avx(auVar12,auVar126);
      auVar126 = vcmpps_avx(auVar243,auVar287,6);
      auVar126 = vorps_avx(auVar129,auVar126);
      auVar288._8_4_ = 0x7f800000;
      auVar288._0_8_ = 0x7f8000007f800000;
      auVar288._12_4_ = 0x7f800000;
      auVar288._16_4_ = 0x7f800000;
      auVar288._20_4_ = 0x7f800000;
      auVar288._24_4_ = 0x7f800000;
      auVar288._28_4_ = 0x7f800000;
      auVar126 = vblendvps_avx(auVar58,auVar288,auVar126);
      auVar12 = vminps_avx(auVar130,auVar126);
      fVar239 = -local_8a0._0_4_;
      fVar247 = -local_8a0._4_4_;
      fVar250 = -local_8a0._8_4_;
      fVar222 = -local_8a0._12_4_;
      fVar232 = -local_8a0._16_4_;
      fVar234 = -local_8a0._20_4_;
      fVar235 = -local_8a0._24_4_;
      auVar244._0_8_ = local_a00._0_8_ ^ 0x8000000080000000;
      auVar244._8_4_ = -local_a00._8_4_;
      auVar244._12_4_ = -local_a00._12_4_;
      auVar244._16_4_ = -local_a00._16_4_;
      auVar244._20_4_ = -local_a00._20_4_;
      auVar244._24_4_ = -local_a00._24_4_;
      auVar244._28_4_ = local_a00._28_4_ ^ 0x80000000;
      auVar129 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar126 = vsubps_avx(auVar129,_local_9c0);
      auVar129 = vsubps_avx(auVar129,auVar176);
      auVar59._4_4_ = auVar129._4_4_ * fVar247;
      auVar59._0_4_ = auVar129._0_4_ * fVar239;
      auVar59._8_4_ = auVar129._8_4_ * fVar250;
      auVar59._12_4_ = auVar129._12_4_ * fVar222;
      auVar59._16_4_ = auVar129._16_4_ * fVar232;
      auVar59._20_4_ = auVar129._20_4_ * fVar234;
      auVar59._24_4_ = auVar129._24_4_ * fVar235;
      auVar59._28_4_ = auVar129._28_4_;
      auVar5 = vfmadd231ps_fma(auVar59,auVar244,auVar126);
      auVar255._0_8_ = local_a40._0_8_ ^ 0x8000000080000000;
      auVar255._8_4_ = -local_a40._8_4_;
      auVar255._12_4_ = -local_a40._12_4_;
      auVar255._16_4_ = -local_a40._16_4_;
      auVar255._20_4_ = -local_a40._20_4_;
      auVar255._24_4_ = -local_a40._24_4_;
      auVar255._28_4_ = uStack_a24 ^ 0x80000000;
      auVar126 = vsubps_avx(ZEXT1232(ZEXT812(0)) << 0x20,auVar152);
      auVar6 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar255,auVar126);
      auVar60._4_4_ = fVar247 * fVar111;
      auVar60._0_4_ = fVar239 * fVar111;
      auVar60._8_4_ = fVar250 * fVar111;
      auVar60._12_4_ = fVar222 * fVar111;
      auVar60._16_4_ = fVar232 * fVar111;
      auVar60._20_4_ = fVar234 * fVar111;
      auVar60._24_4_ = fVar235 * fVar111;
      auVar60._28_4_ = local_8a0._28_4_ ^ 0x80000000;
      auVar5 = vfmadd231ps_fma(auVar60,_local_a60,auVar244);
      auVar296 = vfmadd231ps_fma(ZEXT1632(auVar5),_local_860,auVar255);
      auVar126 = vandps_avx(local_8c0,ZEXT1632(auVar296));
      auVar152 = vrcpps_avx(ZEXT1632(auVar296));
      auVar180._8_4_ = 0x219392ef;
      auVar180._0_8_ = 0x219392ef219392ef;
      auVar180._12_4_ = 0x219392ef;
      auVar180._16_4_ = 0x219392ef;
      auVar180._20_4_ = 0x219392ef;
      auVar180._24_4_ = 0x219392ef;
      auVar180._28_4_ = 0x219392ef;
      auVar129 = vcmpps_avx(auVar126,auVar180,1);
      auVar176 = ZEXT1632(auVar296);
      auVar5 = vfnmadd213ps_fma(auVar152,auVar176,auVar229);
      auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar152,auVar152);
      auVar256._0_8_ = auVar296._0_8_ ^ 0x8000000080000000;
      auVar256._8_4_ = auVar296._8_4_ ^ 0x80000000;
      auVar256._12_4_ = auVar296._12_4_ ^ 0x80000000;
      auVar256._16_4_ = 0x80000000;
      auVar256._20_4_ = 0x80000000;
      auVar256._24_4_ = 0x80000000;
      auVar256._28_4_ = 0x80000000;
      auVar263 = ZEXT3264(auVar256);
      auVar61._4_4_ = auVar5._4_4_ * -auVar6._4_4_;
      auVar61._0_4_ = auVar5._0_4_ * -auVar6._0_4_;
      auVar61._8_4_ = auVar5._8_4_ * -auVar6._8_4_;
      auVar61._12_4_ = auVar5._12_4_ * -auVar6._12_4_;
      auVar61._16_4_ = 0x80000000;
      auVar61._20_4_ = 0x80000000;
      auVar61._24_4_ = 0x80000000;
      auVar61._28_4_ = 0x80000000;
      auVar126 = vcmpps_avx(auVar176,auVar256,1);
      auVar126 = vorps_avx(auVar126,auVar129);
      auVar154._8_4_ = 0xff800000;
      auVar154._0_8_ = 0xff800000ff800000;
      auVar154._12_4_ = 0xff800000;
      auVar154._16_4_ = 0xff800000;
      auVar154._20_4_ = 0xff800000;
      auVar154._24_4_ = 0xff800000;
      auVar154._28_4_ = 0xff800000;
      auVar126 = vblendvps_avx(auVar61,auVar154,auVar126);
      auVar281 = ZEXT3264(auVar126);
      local_980 = vmaxps_avx(auVar259,auVar126);
      auVar126 = vcmpps_avx(auVar176,auVar256,6);
      auVar126 = vorps_avx(auVar129,auVar126);
      auVar181._8_4_ = 0x7f800000;
      auVar181._0_8_ = 0x7f8000007f800000;
      auVar181._12_4_ = 0x7f800000;
      auVar181._16_4_ = 0x7f800000;
      auVar181._20_4_ = 0x7f800000;
      auVar181._24_4_ = 0x7f800000;
      auVar181._28_4_ = 0x7f800000;
      auVar129 = vblendvps_avx(auVar61,auVar181,auVar126);
      auVar126 = vandps_avx(auVar187,local_7e0);
      local_2e0 = vminps_avx(auVar12,auVar129);
      auVar187 = vcmpps_avx(local_980,local_2e0,2);
      auVar129 = auVar126 & auVar187;
      if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar129 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar129 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar129 >> 0x7f,0) == '\0') &&
            (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar129 >> 0xbf,0) == '\0') &&
          (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar129[0x1f]) {
LAB_017e887d:
        auVar290 = ZEXT3264(auVar12);
      }
      else {
        auVar293 = ZEXT3264(auVar229);
        auVar96._4_4_ = fStack_27c;
        auVar96._0_4_ = local_280;
        auVar96._8_4_ = fStack_278;
        auVar96._12_4_ = fStack_274;
        auVar96._16_4_ = uStack_270;
        auVar96._20_4_ = uStack_26c;
        auVar96._24_4_ = uStack_268;
        auVar96._28_4_ = uStack_264;
        auVar129 = vminps_avx(auVar96,auVar229);
        auVar72 = ZEXT812(0);
        auVar208 = ZEXT1264(auVar72) << 0x20;
        auVar129 = vmaxps_avx(auVar129,ZEXT1232(auVar72) << 0x20);
        auVar95._4_4_ = fStack_2bc;
        auVar95._0_4_ = local_2c0;
        auVar95._8_4_ = fStack_2b8;
        auVar95._12_4_ = fStack_2b4;
        auVar95._16_4_ = uStack_2b0;
        auVar95._20_4_ = uStack_2ac;
        auVar95._24_4_ = uStack_2a8;
        auVar95._28_4_ = uStack_2a4;
        auVar259 = vminps_avx(auVar95,auVar229);
        auVar259 = vmaxps_avx(auVar259,ZEXT1232(auVar72) << 0x20);
        fVar239 = DAT_01faff40._28_4_;
        auVar62._4_4_ = (auVar129._4_4_ + DAT_01faff40._4_4_) * 0.125;
        auVar62._0_4_ = (auVar129._0_4_ + (float)DAT_01faff40) * 0.125;
        auVar62._8_4_ = (auVar129._8_4_ + DAT_01faff40._8_4_) * 0.125;
        auVar62._12_4_ = (auVar129._12_4_ + DAT_01faff40._12_4_) * 0.125;
        auVar62._16_4_ = (auVar129._16_4_ + DAT_01faff40._16_4_) * 0.125;
        auVar62._20_4_ = (auVar129._20_4_ + DAT_01faff40._20_4_) * 0.125;
        auVar62._24_4_ = (auVar129._24_4_ + DAT_01faff40._24_4_) * 0.125;
        auVar62._28_4_ = auVar129._28_4_ + fVar239;
        auVar5 = vfmadd213ps_fma(auVar62,local_a20,auVar237);
        auVar63._4_4_ = (auVar259._4_4_ + DAT_01faff40._4_4_) * 0.125;
        auVar63._0_4_ = (auVar259._0_4_ + (float)DAT_01faff40) * 0.125;
        auVar63._8_4_ = (auVar259._8_4_ + DAT_01faff40._8_4_) * 0.125;
        auVar63._12_4_ = (auVar259._12_4_ + DAT_01faff40._12_4_) * 0.125;
        auVar63._16_4_ = (auVar259._16_4_ + DAT_01faff40._16_4_) * 0.125;
        auVar63._20_4_ = (auVar259._20_4_ + DAT_01faff40._20_4_) * 0.125;
        auVar63._24_4_ = (auVar259._24_4_ + DAT_01faff40._24_4_) * 0.125;
        auVar63._28_4_ = auVar259._28_4_ + fVar239;
        auVar6 = vfmadd213ps_fma(auVar63,local_a20,auVar237);
        auVar129 = vminps_avx(auVar227,local_960);
        auVar259 = vminps_avx(local_840,auVar226);
        auVar129 = vminps_avx(auVar129,auVar259);
        auVar13 = vsubps_avx(auVar129,auVar13);
        auVar126 = vandps_avx(auVar187,auVar126);
        local_1a0 = ZEXT1632(auVar5);
        local_1c0 = ZEXT1632(auVar6);
        auVar64._4_4_ = auVar13._4_4_ * 0.99999976;
        auVar64._0_4_ = auVar13._0_4_ * 0.99999976;
        auVar64._8_4_ = auVar13._8_4_ * 0.99999976;
        auVar64._12_4_ = auVar13._12_4_ * 0.99999976;
        auVar64._16_4_ = auVar13._16_4_ * 0.99999976;
        auVar64._20_4_ = auVar13._20_4_ * 0.99999976;
        auVar64._24_4_ = auVar13._24_4_ * 0.99999976;
        auVar64._28_4_ = auVar13._28_4_;
        auVar187 = vmaxps_avx(ZEXT832(0) << 0x20,auVar64);
        auVar65._4_4_ = auVar187._4_4_ * auVar187._4_4_;
        auVar65._0_4_ = auVar187._0_4_ * auVar187._0_4_;
        auVar65._8_4_ = auVar187._8_4_ * auVar187._8_4_;
        auVar65._12_4_ = auVar187._12_4_ * auVar187._12_4_;
        auVar65._16_4_ = auVar187._16_4_ * auVar187._16_4_;
        auVar65._20_4_ = auVar187._20_4_ * auVar187._20_4_;
        auVar65._24_4_ = auVar187._24_4_ * auVar187._24_4_;
        auVar65._28_4_ = auVar187._28_4_;
        auVar13 = vsubps_avx(auVar14,auVar65);
        auVar66._4_4_ = auVar13._4_4_ * fVar219 * 4.0;
        auVar66._0_4_ = auVar13._0_4_ * fVar233 * 4.0;
        auVar66._8_4_ = auVar13._8_4_ * fVar291 * 4.0;
        auVar66._12_4_ = auVar13._12_4_ * fVar220 * 4.0;
        auVar66._16_4_ = auVar13._16_4_ * fVar221 * 4.0;
        auVar66._20_4_ = auVar13._20_4_ * fVar251 * 4.0;
        auVar66._24_4_ = auVar13._24_4_ * fVar264 * 4.0;
        auVar66._28_4_ = auVar187._28_4_;
        auVar14 = vsubps_avx(auVar51,auVar66);
        auVar187 = vcmpps_avx(auVar14,ZEXT1232(auVar72) << 0x20,5);
        if ((((((((auVar187 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar187 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar187 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar187 >> 0x7f,0) == '\0') &&
              (auVar187 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar187 >> 0xbf,0) == '\0') &&
            (auVar187 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar187[0x1f]) {
          auVar134 = SUB6432(ZEXT864(0),0) << 0x20;
          local_900 = ZEXT832(0) << 0x20;
          _local_800 = ZEXT832(0) << 0x20;
          auVar129 = ZEXT832(0) << 0x40;
          auVar245._8_4_ = 0x7f800000;
          auVar245._0_8_ = 0x7f8000007f800000;
          auVar245._12_4_ = 0x7f800000;
          auVar245._16_4_ = 0x7f800000;
          auVar245._20_4_ = 0x7f800000;
          auVar245._24_4_ = 0x7f800000;
          auVar245._28_4_ = 0x7f800000;
          auVar257._8_4_ = 0xff800000;
          auVar257._0_8_ = 0xff800000ff800000;
          auVar257._12_4_ = 0xff800000;
          auVar257._16_4_ = 0xff800000;
          auVar257._20_4_ = 0xff800000;
          auVar257._24_4_ = 0xff800000;
          auVar257._28_4_ = 0xff800000;
          auVar280 = local_a20;
          local_8e0 = local_900;
        }
        else {
          auVar259 = vsqrtps_avx(auVar14);
          auVar258._0_4_ = fVar233 + fVar233;
          auVar258._4_4_ = fVar219 + fVar219;
          auVar258._8_4_ = fVar291 + fVar291;
          auVar258._12_4_ = fVar220 + fVar220;
          auVar258._16_4_ = fVar221 + fVar221;
          auVar258._20_4_ = fVar251 + fVar251;
          auVar258._24_4_ = fVar264 + fVar264;
          auVar258._28_4_ = fVar209 + fVar209;
          auVar129 = vrcpps_avx(auVar258);
          auVar5 = vfnmadd213ps_fma(auVar258,auVar129,auVar229);
          auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar129,auVar129);
          auVar279._0_8_ = auVar253._0_8_ ^ 0x8000000080000000;
          auVar279._8_4_ = -auVar253._8_4_;
          auVar279._12_4_ = -auVar253._12_4_;
          auVar279._16_4_ = -auVar253._16_4_;
          auVar279._20_4_ = -auVar253._20_4_;
          auVar279._24_4_ = -auVar253._24_4_;
          auVar279._28_4_ = -auVar253._28_4_;
          auVar129 = vsubps_avx(auVar279,auVar259);
          auVar12 = vsubps_avx(auVar259,auVar253);
          fVar209 = auVar129._0_4_ * auVar5._0_4_;
          fVar247 = auVar129._4_4_ * auVar5._4_4_;
          auVar67._4_4_ = fVar247;
          auVar67._0_4_ = fVar209;
          fVar250 = auVar129._8_4_ * auVar5._8_4_;
          auVar67._8_4_ = fVar250;
          fVar222 = auVar129._12_4_ * auVar5._12_4_;
          auVar67._12_4_ = fVar222;
          fVar232 = auVar129._16_4_ * 0.0;
          auVar67._16_4_ = fVar232;
          fVar233 = auVar129._20_4_ * 0.0;
          auVar67._20_4_ = fVar233;
          fVar234 = auVar129._24_4_ * 0.0;
          auVar67._24_4_ = fVar234;
          auVar67._28_4_ = auVar259._28_4_;
          fVar235 = auVar5._0_4_ * auVar12._0_4_;
          fVar236 = auVar5._4_4_ * auVar12._4_4_;
          auVar280._4_4_ = fVar236;
          auVar280._0_4_ = fVar235;
          fVar219 = auVar5._8_4_ * auVar12._8_4_;
          auVar280._8_4_ = fVar219;
          fVar291 = auVar5._12_4_ * auVar12._12_4_;
          auVar280._12_4_ = fVar291;
          fVar220 = auVar12._16_4_ * 0.0;
          auVar280._16_4_ = fVar220;
          fVar221 = auVar12._20_4_ * 0.0;
          auVar280._20_4_ = fVar221;
          fVar251 = auVar12._24_4_ * 0.0;
          auVar280._24_4_ = fVar251;
          auVar280._28_4_ = auVar129._28_4_;
          auVar5 = vfmadd213ps_fma(auVar274,auVar67,auVar297);
          auVar6 = vfmadd213ps_fma(auVar274,auVar280,auVar297);
          auVar259 = ZEXT1632(CONCAT412(fVar231 * auVar5._12_4_,
                                        CONCAT48(fVar249 * auVar5._8_4_,
                                                 CONCAT44(fVar246 * auVar5._4_4_,
                                                          fVar113 * auVar5._0_4_))));
          auVar129 = ZEXT1632(CONCAT412(fVar231 * auVar6._12_4_,
                                        CONCAT48(fVar249 * auVar6._8_4_,
                                                 CONCAT44(fVar246 * auVar6._4_4_,
                                                          fVar113 * auVar6._0_4_))));
          auVar5 = vfmadd213ps_fma(auVar15,auVar259,auVar178);
          auVar6 = vfmadd213ps_fma(auVar15,auVar129,auVar178);
          auVar296 = vfmadd213ps_fma(auVar16,auVar259,auVar153);
          auVar114 = vfmadd213ps_fma(auVar16,auVar129,auVar153);
          auVar173 = vfmadd213ps_fma(auVar259,auVar134,auVar292);
          auVar223 = vfmadd213ps_fma(auVar134,auVar129,auVar292);
          auVar293 = ZEXT1664(auVar223);
          auVar68._4_4_ = (float)local_860._4_4_ * fVar247;
          auVar68._0_4_ = (float)local_860._0_4_ * fVar209;
          auVar68._8_4_ = fStack_858 * fVar250;
          auVar68._12_4_ = fStack_854 * fVar222;
          auVar68._16_4_ = fStack_850 * fVar232;
          auVar68._20_4_ = fStack_84c * fVar233;
          auVar68._24_4_ = fStack_848 * fVar234;
          auVar68._28_4_ = 0;
          auVar134 = vsubps_avx(auVar68,ZEXT1632(auVar5));
          auVar99._4_4_ = (float)local_a60._4_4_ * fVar247;
          auVar99._0_4_ = (float)local_a60._0_4_ * fVar209;
          auVar99._8_4_ = fStack_a58 * fVar250;
          auVar99._12_4_ = fStack_a54 * fVar222;
          auVar99._16_4_ = fStack_a50 * fVar232;
          auVar99._20_4_ = fStack_a4c * fVar233;
          auVar99._24_4_ = fStack_a48 * fVar234;
          auVar99._28_4_ = fVar239;
          auVar129 = vsubps_avx(auVar99,ZEXT1632(auVar296));
          auVar182._0_4_ = fVar111 * fVar209;
          auVar182._4_4_ = fVar111 * fVar247;
          auVar182._8_4_ = fVar111 * fVar250;
          auVar182._12_4_ = fVar111 * fVar222;
          auVar182._16_4_ = fVar111 * fVar232;
          auVar182._20_4_ = fVar111 * fVar233;
          auVar182._24_4_ = fVar111 * fVar234;
          auVar182._28_4_ = 0;
          auVar15 = vsubps_avx(auVar182,ZEXT1632(auVar173));
          auVar208 = ZEXT3264(auVar15);
          auVar260._0_4_ = (float)local_860._0_4_ * fVar235;
          auVar260._4_4_ = (float)local_860._4_4_ * fVar236;
          auVar260._8_4_ = fStack_858 * fVar219;
          auVar260._12_4_ = fStack_854 * fVar291;
          auVar260._16_4_ = fStack_850 * fVar220;
          auVar260._20_4_ = fStack_84c * fVar221;
          auVar260._24_4_ = fStack_848 * fVar251;
          auVar260._28_4_ = 0;
          local_8e0 = vsubps_avx(auVar260,ZEXT1632(auVar6));
          auVar69._4_4_ = (float)local_a60._4_4_ * fVar236;
          auVar69._0_4_ = (float)local_a60._0_4_ * fVar235;
          auVar69._8_4_ = fStack_a58 * fVar219;
          auVar69._12_4_ = fStack_a54 * fVar291;
          auVar69._16_4_ = fStack_a50 * fVar220;
          auVar69._20_4_ = fStack_a4c * fVar221;
          auVar69._24_4_ = fStack_a48 * fVar251;
          auVar69._28_4_ = local_8e0._28_4_;
          local_900 = vsubps_avx(auVar69,ZEXT1632(auVar114));
          auVar70._4_4_ = fVar111 * fVar236;
          auVar70._0_4_ = fVar111 * fVar235;
          auVar70._8_4_ = fVar111 * fVar219;
          auVar70._12_4_ = fVar111 * fVar291;
          auVar70._16_4_ = fVar111 * fVar220;
          auVar70._20_4_ = fVar111 * fVar221;
          auVar70._24_4_ = fVar111 * fVar251;
          auVar70._28_4_ = local_900._28_4_;
          _local_800 = vsubps_avx(auVar70,ZEXT1632(auVar223));
          auVar275 = ZEXT864(0) << 0x20;
          auVar15 = vcmpps_avx(auVar14,_DAT_01faff00,5);
          auVar261._8_4_ = 0x7f800000;
          auVar261._0_8_ = 0x7f8000007f800000;
          auVar261._12_4_ = 0x7f800000;
          auVar261._16_4_ = 0x7f800000;
          auVar261._20_4_ = 0x7f800000;
          auVar261._24_4_ = 0x7f800000;
          auVar261._28_4_ = 0x7f800000;
          auVar245 = vblendvps_avx(auVar261,auVar67,auVar15);
          auVar14 = vandps_avx(local_8c0,auVar50);
          auVar14 = vmaxps_avx(local_640,auVar14);
          auVar71._4_4_ = auVar14._4_4_ * 1.9073486e-06;
          auVar71._0_4_ = auVar14._0_4_ * 1.9073486e-06;
          auVar71._8_4_ = auVar14._8_4_ * 1.9073486e-06;
          auVar71._12_4_ = auVar14._12_4_ * 1.9073486e-06;
          auVar71._16_4_ = auVar14._16_4_ * 1.9073486e-06;
          auVar71._20_4_ = auVar14._20_4_ * 1.9073486e-06;
          auVar71._24_4_ = auVar14._24_4_ * 1.9073486e-06;
          auVar71._28_4_ = auVar14._28_4_;
          auVar14 = vandps_avx(local_8c0,local_6a0);
          auVar14 = vcmpps_avx(auVar14,auVar71,1);
          auVar262._8_4_ = 0xff800000;
          auVar262._0_8_ = 0xff800000ff800000;
          auVar262._12_4_ = 0xff800000;
          auVar262._16_4_ = 0xff800000;
          auVar262._20_4_ = 0xff800000;
          auVar262._24_4_ = 0xff800000;
          auVar262._28_4_ = 0xff800000;
          auVar257 = vblendvps_avx(auVar262,auVar280,auVar15);
          auVar259 = auVar15 & auVar14;
          if ((((((((auVar259 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar259 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar259 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar259 >> 0x7f,0) != '\0') ||
                (auVar259 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar259 >> 0xbf,0) != '\0') ||
              (auVar259 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar259[0x1f] < '\0') {
            auVar187 = vandps_avx(auVar14,auVar15);
            auVar14 = vcmpps_avx(auVar13,ZEXT832(0) << 0x20,2);
            auVar280._8_4_ = 0xff800000;
            auVar280._0_8_ = 0xff800000ff800000;
            auVar280._12_4_ = 0xff800000;
            auVar280._16_4_ = 0xff800000;
            auVar280._20_4_ = 0xff800000;
            auVar280._24_4_ = 0xff800000;
            auVar280._28_4_ = 0xff800000;
            auVar289._8_4_ = 0x7f800000;
            auVar289._0_8_ = 0x7f8000007f800000;
            auVar289._12_4_ = 0x7f800000;
            auVar289._16_4_ = 0x7f800000;
            auVar289._20_4_ = 0x7f800000;
            auVar289._24_4_ = 0x7f800000;
            auVar289._28_4_ = 0x7f800000;
            auVar13 = vblendvps_avx(auVar289,auVar280,auVar14);
            auVar5 = vpackssdw_avx(auVar187._0_16_,auVar187._16_16_);
            auVar259 = vpmovsxwd_avx2(auVar5);
            auVar245 = vblendvps_avx(auVar245,auVar13,auVar259);
            auVar13 = vblendvps_avx(auVar280,auVar289,auVar14);
            auVar275 = ZEXT3264(auVar13);
            auVar257 = vblendvps_avx(auVar257,auVar13,auVar259);
            auVar230._0_8_ = auVar187._0_8_ ^ 0xffffffffffffffff;
            auVar230._8_4_ = auVar187._8_4_ ^ 0xffffffff;
            auVar230._12_4_ = auVar187._12_4_ ^ 0xffffffff;
            auVar230._16_4_ = auVar187._16_4_ ^ 0xffffffff;
            auVar230._20_4_ = auVar187._20_4_ ^ 0xffffffff;
            auVar230._24_4_ = auVar187._24_4_ ^ 0xffffffff;
            auVar230._28_4_ = auVar187._28_4_ ^ 0xffffffff;
            auVar187 = vorps_avx(auVar14,auVar230);
            auVar187 = vandps_avx(auVar15,auVar187);
          }
        }
        auVar281 = ZEXT3264(auVar280);
        auVar268 = ZEXT3264(local_980);
        local_460 = local_980;
        local_440 = vminps_avx(local_2e0,auVar245);
        auVar14 = vmaxps_avx(local_980,auVar257);
        local_300 = auVar14;
        auVar13 = vcmpps_avx(local_980,local_440,2);
        local_740 = vandps_avx(auVar13,auVar126);
        auVar13 = vcmpps_avx(auVar14,local_2e0,2);
        local_7c0 = vandps_avx(auVar13,auVar126);
        auVar263 = ZEXT3264(local_7c0);
        auVar126 = vorps_avx(local_7c0,local_740);
        auVar12 = auVar271;
        if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar126 >> 0x7f,0) == '\0') &&
              (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar126 >> 0xbf,0) == '\0') &&
            (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar126[0x1f]) goto LAB_017e887d;
        local_780._0_8_ = auVar187._0_8_ ^ 0xffffffffffffffff;
        local_780._8_4_ = auVar187._8_4_ ^ 0xffffffff;
        local_780._12_4_ = auVar187._12_4_ ^ 0xffffffff;
        local_780._16_4_ = auVar187._16_4_ ^ 0xffffffff;
        local_780._20_4_ = auVar187._20_4_ ^ 0xffffffff;
        local_780._24_4_ = auVar187._24_4_ ^ 0xffffffff;
        local_780._28_4_ = auVar187._28_4_ ^ 0xffffffff;
        auVar290._0_4_ = fVar111 * auVar208._0_4_;
        auVar290._4_4_ = fVar111 * auVar208._4_4_;
        auVar290._8_4_ = fVar111 * auVar208._8_4_;
        auVar290._12_4_ = fVar111 * auVar208._12_4_;
        auVar290._16_4_ = fVar111 * auVar208._16_4_;
        auVar290._20_4_ = fVar111 * auVar208._20_4_;
        auVar290._28_36_ = auVar208._28_36_;
        auVar290._24_4_ = fVar111 * auVar208._24_4_;
        auVar5 = vfmadd213ps_fma(auVar129,_local_a60,auVar290._0_32_);
        auVar5 = vfmadd213ps_fma(auVar134,_local_860,ZEXT1632(auVar5));
        auVar126 = vandps_avx(ZEXT1632(auVar5),local_8c0);
        auVar157._8_4_ = 0x3e99999a;
        auVar157._0_8_ = 0x3e99999a3e99999a;
        auVar157._12_4_ = 0x3e99999a;
        auVar157._16_4_ = 0x3e99999a;
        auVar157._20_4_ = 0x3e99999a;
        auVar157._24_4_ = 0x3e99999a;
        auVar157._28_4_ = 0x3e99999a;
        auVar126 = vcmpps_avx(auVar126,auVar157,1);
        auVar126 = vorps_avx(auVar126,local_780);
        auVar158._8_4_ = 3;
        auVar158._0_8_ = 0x300000003;
        auVar158._12_4_ = 3;
        auVar158._16_4_ = 3;
        auVar158._20_4_ = 3;
        auVar158._24_4_ = 3;
        auVar158._28_4_ = 3;
        auVar183._8_4_ = 2;
        auVar183._0_8_ = 0x200000002;
        auVar183._12_4_ = 2;
        auVar183._16_4_ = 2;
        auVar183._20_4_ = 2;
        auVar183._24_4_ = 2;
        auVar183._28_4_ = 2;
        auVar126 = vblendvps_avx(auVar183,auVar158,auVar126);
        local_7a0._4_4_ = local_c88;
        local_7a0._0_4_ = local_c88;
        local_7a0._8_4_ = local_c88;
        local_7a0._12_4_ = local_c88;
        local_7a0._16_4_ = local_c88;
        local_7a0._20_4_ = local_c88;
        local_7a0._24_4_ = local_c88;
        local_7a0._28_4_ = local_c88;
        local_760 = vpcmpgtd_avx2(auVar126,local_7a0);
        local_700 = vpandn_avx2(local_760,local_740);
        auVar208 = ZEXT3264(local_700);
        auVar126 = local_740 & ~local_760;
        fStack_b7c = auVar1._4_4_;
        fStack_b78 = auVar1._8_4_;
        fStack_b74 = auVar1._12_4_;
        if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar126 >> 0x7f,0) == '\0') &&
              (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar126 >> 0xbf,0) == '\0') &&
            (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar126[0x1f]) {
          auVar138._4_4_ = fVar248;
          auVar138._0_4_ = fVar248;
          auVar138._8_4_ = fVar248;
          auVar138._12_4_ = fVar248;
          auVar138._16_4_ = fVar248;
          auVar138._20_4_ = fVar248;
          auVar138._24_4_ = fVar248;
          auVar138._28_4_ = fVar248;
          local_7c0 = auVar16;
          unique0x10014059 = local_a40._16_16_;
        }
        else {
          auVar6 = vminps_avx(auVar2,auVar4);
          auVar5 = vmaxps_avx(auVar2,auVar4);
          auVar296 = vminps_avx(auVar3,auVar1);
          auVar114 = vminps_avx(auVar6,auVar296);
          auVar6 = vmaxps_avx(auVar3,auVar1);
          auVar296 = vmaxps_avx(auVar5,auVar6);
          auVar190._8_4_ = 0x7fffffff;
          auVar190._0_8_ = 0x7fffffff7fffffff;
          auVar190._12_4_ = 0x7fffffff;
          auVar5 = vandps_avx(auVar114,auVar190);
          local_8a0._0_16_ = auVar190;
          auVar6 = vandps_avx(auVar296,auVar190);
          auVar5 = vmaxps_avx(auVar5,auVar6);
          auVar6 = vmovshdup_avx(auVar5);
          auVar6 = vmaxss_avx(auVar6,auVar5);
          auVar5 = vshufpd_avx(auVar5,auVar5,1);
          auVar5 = vmaxss_avx(auVar5,auVar6);
          fVar209 = auVar5._0_4_ * 1.9073486e-06;
          auVar5 = vshufps_avx(auVar296,auVar296,0xff);
          local_880._4_4_ = local_980._4_4_ + (float)local_9e0._4_4_;
          local_880._0_4_ = local_980._0_4_ + (float)local_9e0._0_4_;
          fStack_878 = local_980._8_4_ + fStack_9d8;
          fStack_874 = local_980._12_4_ + fStack_9d4;
          fStack_870 = local_980._16_4_ + fStack_9d0;
          fStack_86c = local_980._20_4_ + fStack_9cc;
          fStack_868 = local_980._24_4_ + fStack_9c8;
          fStack_864 = local_980._28_4_ + fStack_9c4;
          do {
            auVar139._8_4_ = 0x7f800000;
            auVar139._0_8_ = 0x7f8000007f800000;
            auVar139._12_4_ = 0x7f800000;
            auVar139._16_4_ = 0x7f800000;
            auVar139._20_4_ = 0x7f800000;
            auVar139._24_4_ = 0x7f800000;
            auVar139._28_4_ = 0x7f800000;
            auVar126 = auVar208._0_32_;
            auVar187 = vblendvps_avx(auVar139,local_980,auVar126);
            auVar13 = vshufps_avx(auVar187,auVar187,0xb1);
            auVar13 = vminps_avx(auVar187,auVar13);
            auVar15 = vshufpd_avx(auVar13,auVar13,5);
            auVar13 = vminps_avx(auVar13,auVar15);
            auVar15 = vpermpd_avx2(auVar13,0x4e);
            auVar13 = vminps_avx(auVar13,auVar15);
            auVar187 = vcmpps_avx(auVar187,auVar13,0);
            auVar13 = auVar126 & auVar187;
            if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar13 >> 0x7f,0) != '\0') ||
                  (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar13 >> 0xbf,0) != '\0') ||
                (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar13[0x1f] < '\0') {
              auVar126 = vandps_avx(auVar187,auVar126);
            }
            uVar104 = vmovmskps_avx(auVar126);
            iVar17 = 0;
            for (; (uVar104 & 1) == 0; uVar104 = uVar104 >> 1 | 0x80000000) {
              iVar17 = iVar17 + 1;
            }
            uVar105 = iVar17 << 2;
            *(undefined4 *)(local_700 + uVar105) = 0;
            uVar104 = *(uint *)(local_1a0 + uVar105);
            uVar105 = *(uint *)(local_460 + uVar105);
            fVar113 = auVar10._0_4_;
            if ((float)local_9a0._0_4_ < 0.0) {
              fVar113 = sqrtf((float)local_9a0._0_4_);
            }
            local_a00._0_4_ = fVar113 * 1.9073486e-06;
            auVar6 = vinsertps_avx(ZEXT416(uVar105),ZEXT416(uVar104),0x10);
            auVar268 = ZEXT1664(auVar6);
            bVar110 = true;
            uVar106 = 0;
            do {
              fVar249 = auVar268._0_4_;
              auVar116._4_4_ = fVar249;
              auVar116._0_4_ = fVar249;
              auVar116._8_4_ = fVar249;
              auVar116._12_4_ = fVar249;
              auVar114 = vfmadd213ps_fma(auVar116,local_990,_DAT_01f7aa10);
              auVar296 = vmovshdup_avx(auVar268._0_16_);
              fVar250 = auVar296._0_4_;
              fVar248 = 1.0 - fVar250;
              auVar117 = SUB6416(ZEXT464(0x40400000),0);
              auVar122 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar173 = vfmadd213ss_fma(auVar117,auVar296,auVar122);
              auVar6 = vfmadd213ss_fma(auVar173,ZEXT416((uint)(fVar250 * fVar250)),
                                       SUB6416(ZEXT464(0x40000000),0));
              auVar223 = vfmadd213ss_fma(auVar117,ZEXT416((uint)fVar248),auVar122);
              auVar223 = vfmadd213ss_fma(auVar223,ZEXT416((uint)(fVar248 * fVar248)),
                                         SUB6416(ZEXT464(0x40000000),0));
              fVar113 = fVar248 * fVar248 * -fVar250 * 0.5;
              fVar239 = auVar6._0_4_ * 0.5;
              fVar246 = auVar223._0_4_ * 0.5;
              fVar247 = fVar250 * fVar250 * -fVar248 * 0.5;
              auVar191._0_4_ = fVar247 * fVar189;
              auVar191._4_4_ = fVar247 * fStack_b7c;
              auVar191._8_4_ = fVar247 * fStack_b78;
              auVar191._12_4_ = fVar247 * fStack_b74;
              auVar210._4_4_ = fVar246;
              auVar210._0_4_ = fVar246;
              auVar210._8_4_ = fVar246;
              auVar210._12_4_ = fVar246;
              auVar6 = vfmadd132ps_fma(auVar210,auVar191,auVar3);
              auVar163._4_4_ = fVar239;
              auVar163._0_4_ = fVar239;
              auVar163._8_4_ = fVar239;
              auVar163._12_4_ = fVar239;
              auVar6 = vfmadd132ps_fma(auVar163,auVar6,auVar4);
              auVar192._4_4_ = fVar113;
              auVar192._0_4_ = fVar113;
              auVar192._8_4_ = fVar113;
              auVar192._12_4_ = fVar113;
              auVar6 = vfmadd132ps_fma(auVar192,auVar6,auVar2);
              auVar122 = vfmadd231ss_fma(auVar122,auVar296,ZEXT416(0x41100000));
              auVar223 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar296,ZEXT416(0x40800000)
                                        );
              local_820._0_16_ = auVar6;
              auVar6 = vsubps_avx(auVar114,auVar6);
              _local_9c0 = auVar6;
              auVar6 = vdpps_avx(auVar6,auVar6,0x7f);
              auVar114 = vfmadd213ss_fma(auVar117,auVar296,ZEXT416(0xbf800000));
              fVar113 = auVar6._0_4_;
              if (fVar113 < 0.0) {
                local_a40._0_4_ = auVar173._0_4_;
                local_a20._0_16_ = auVar122;
                local_960._0_4_ = fVar248 * -2.0;
                auVar263._0_4_ = sqrtf(fVar113);
                auVar263._4_60_ = extraout_var;
                auVar173 = ZEXT416((uint)local_a40._0_4_);
                auVar117 = auVar263._0_16_;
                fVar239 = (float)local_960._0_4_;
                auVar122 = local_a20._0_16_;
              }
              else {
                auVar117 = vsqrtss_avx(auVar6,auVar6);
                fVar239 = fVar248 * -2.0;
              }
              auVar273 = vfmadd213ss_fma(auVar173,ZEXT416((uint)(fVar250 + fVar250)),
                                         ZEXT416((uint)(fVar250 * fVar250 * 3.0)));
              auVar116 = SUB6416(ZEXT464(0x40000000),0);
              auVar173 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar296,auVar116);
              auVar277 = vfmadd231ss_fma(ZEXT416((uint)(fVar248 * fVar248 * -3.0)),
                                         ZEXT416((uint)(fVar248 + fVar248)),auVar173);
              auVar190 = vfnmadd231ss_fma(ZEXT416((uint)(fVar250 * (fVar248 + fVar248))),
                                          ZEXT416((uint)fVar248),ZEXT416((uint)fVar248));
              auVar173 = vfmadd213ss_fma(ZEXT416((uint)fVar239),auVar296,
                                         ZEXT416((uint)(fVar250 * fVar250)));
              fVar239 = auVar277._0_4_ * 0.5;
              fVar246 = auVar173._0_4_ * 0.5;
              auVar164._0_4_ = fVar189 * fVar246;
              auVar164._4_4_ = fStack_b7c * fVar246;
              auVar164._8_4_ = fStack_b78 * fVar246;
              auVar164._12_4_ = fStack_b74 * fVar246;
              auVar144._4_4_ = fVar239;
              auVar144._0_4_ = fVar239;
              auVar144._8_4_ = fVar239;
              auVar144._12_4_ = fVar239;
              auVar173 = vfmadd213ps_fma(auVar144,auVar3,auVar164);
              fVar239 = auVar190._0_4_ * 0.5;
              fVar246 = auVar273._0_4_ * 0.5;
              auVar165._4_4_ = fVar246;
              auVar165._0_4_ = fVar246;
              auVar165._8_4_ = fVar246;
              auVar165._12_4_ = fVar246;
              auVar173 = vfmadd213ps_fma(auVar165,auVar4,auVar173);
              auVar269._4_4_ = fVar239;
              auVar269._0_4_ = fVar239;
              auVar269._8_4_ = fVar239;
              auVar269._12_4_ = fVar239;
              auVar273 = vfmadd213ps_fma(auVar269,auVar2,auVar173);
              auVar173 = vfmadd213ss_fma(auVar296,SUB6416(ZEXT464(0xc0400000),0),auVar116);
              local_ba0 = auVar114._0_4_;
              auVar118._0_4_ = fVar189 * local_ba0;
              auVar118._4_4_ = fStack_b7c * local_ba0;
              auVar118._8_4_ = fStack_b78 * local_ba0;
              auVar118._12_4_ = fStack_b74 * local_ba0;
              local_b00 = auVar223._0_4_;
              auVar145._4_4_ = local_b00;
              auVar145._0_4_ = local_b00;
              auVar145._8_4_ = local_b00;
              auVar145._12_4_ = local_b00;
              auVar296 = vfmadd213ps_fma(auVar145,auVar3,auVar118);
              uVar112 = auVar122._0_4_;
              auVar166._4_4_ = uVar112;
              auVar166._0_4_ = uVar112;
              auVar166._8_4_ = uVar112;
              auVar166._12_4_ = uVar112;
              auVar296 = vfmadd213ps_fma(auVar166,auVar4,auVar296);
              auVar114 = vdpps_avx(auVar273,auVar273,0x7f);
              uVar112 = auVar173._0_4_;
              auVar146._4_4_ = uVar112;
              auVar146._0_4_ = uVar112;
              auVar146._8_4_ = uVar112;
              auVar146._12_4_ = uVar112;
              auVar223 = vfmadd213ps_fma(auVar146,auVar2,auVar296);
              auVar296 = vblendps_avx(auVar114,_DAT_01f7aa10,0xe);
              auVar173 = vrsqrtss_avx(auVar296,auVar296);
              fVar247 = auVar114._0_4_;
              fVar239 = auVar173._0_4_;
              auVar173 = vdpps_avx(auVar273,auVar223,0x7f);
              fVar239 = fVar239 * 1.5 + fVar247 * -0.5 * fVar239 * fVar239 * fVar239;
              auVar147._0_4_ = auVar223._0_4_ * fVar247;
              auVar147._4_4_ = auVar223._4_4_ * fVar247;
              auVar147._8_4_ = auVar223._8_4_ * fVar247;
              auVar147._12_4_ = auVar223._12_4_ * fVar247;
              fVar246 = auVar173._0_4_;
              auVar224._0_4_ = auVar273._0_4_ * fVar246;
              auVar224._4_4_ = auVar273._4_4_ * fVar246;
              fVar248 = auVar273._8_4_;
              auVar224._8_4_ = fVar248 * fVar246;
              fVar250 = auVar273._12_4_;
              auVar224._12_4_ = fVar250 * fVar246;
              auVar173 = vsubps_avx(auVar147,auVar224);
              auVar296 = vrcpss_avx(auVar296,auVar296);
              auVar223 = vfnmadd213ss_fma(auVar296,auVar114,auVar116);
              fVar246 = auVar296._0_4_ * auVar223._0_4_;
              auVar296 = vmaxss_avx(ZEXT416((uint)fVar209),
                                    ZEXT416((uint)(fVar249 * (float)local_a00._0_4_)));
              auVar281 = ZEXT1664(auVar296);
              local_a40._0_8_ = auVar273._0_8_ ^ 0x8000000080000000;
              local_a40._8_4_ = -fVar248;
              local_a40._12_4_ = -fVar250;
              auVar193._0_4_ = fVar239 * auVar173._0_4_ * fVar246;
              auVar193._4_4_ = fVar239 * auVar173._4_4_ * fVar246;
              auVar193._8_4_ = fVar239 * auVar173._8_4_ * fVar246;
              auVar193._12_4_ = fVar239 * auVar173._12_4_ * fVar246;
              auVar241._0_4_ = auVar273._0_4_ * fVar239;
              auVar241._4_4_ = auVar273._4_4_ * fVar239;
              auVar241._8_4_ = fVar248 * fVar239;
              auVar241._12_4_ = fVar250 * fVar239;
              if (fVar247 < -fVar247) {
                fVar239 = sqrtf(fVar247);
                auVar281 = ZEXT464(auVar296._0_4_);
                auVar117 = ZEXT416(auVar117._0_4_);
              }
              else {
                auVar114 = vsqrtss_avx(auVar114,auVar114);
                fVar239 = auVar114._0_4_;
              }
              auVar114 = vdpps_avx(_local_9c0,auVar241,0x7f);
              auVar277 = vfmadd213ss_fma(ZEXT416((uint)fVar209),auVar117,auVar281._0_16_);
              auVar173 = vdpps_avx(local_a40._0_16_,auVar241,0x7f);
              auVar223 = vdpps_avx(_local_9c0,auVar193,0x7f);
              auVar122 = vdpps_avx(local_990,auVar241,0x7f);
              auVar277 = vfmadd213ss_fma(ZEXT416((uint)(auVar117._0_4_ + 1.0)),
                                         ZEXT416((uint)(fVar209 / fVar239)),auVar277);
              auVar275 = ZEXT1664(auVar277);
              fVar239 = auVar173._0_4_ + auVar223._0_4_;
              fVar247 = auVar114._0_4_;
              auVar119._0_4_ = fVar247 * fVar247;
              auVar119._4_4_ = auVar114._4_4_ * auVar114._4_4_;
              auVar119._8_4_ = auVar114._8_4_ * auVar114._8_4_;
              auVar119._12_4_ = auVar114._12_4_ * auVar114._12_4_;
              auVar173 = vdpps_avx(_local_9c0,local_a40._0_16_,0x7f);
              auVar117 = vsubps_avx(auVar6,auVar119);
              auVar223 = vrsqrtss_avx(auVar117,auVar117);
              fVar248 = auVar117._0_4_;
              fVar246 = auVar223._0_4_;
              fVar246 = fVar246 * 1.5 + fVar248 * -0.5 * fVar246 * fVar246 * fVar246;
              auVar223 = vdpps_avx(_local_9c0,local_990,0x7f);
              local_a40._0_16_ = vfnmadd231ss_fma(auVar173,auVar114,ZEXT416((uint)fVar239));
              auVar173 = vfnmadd231ss_fma(auVar223,auVar114,auVar122);
              if (fVar248 < 0.0) {
                local_a20._0_16_ = ZEXT416((uint)fVar239);
                local_960._0_4_ = fVar246;
                local_840._0_16_ = auVar173;
                fVar248 = sqrtf(fVar248);
                auVar275 = ZEXT464(auVar277._0_4_);
                auVar281 = ZEXT464(auVar296._0_4_);
                fVar246 = (float)local_960._0_4_;
                auVar173 = local_840._0_16_;
                auVar296 = local_a20._0_16_;
              }
              else {
                auVar296 = vsqrtss_avx(auVar117,auVar117);
                fVar248 = auVar296._0_4_;
                auVar296 = ZEXT416((uint)fVar239);
              }
              auVar293 = ZEXT1664(auVar114);
              auVar223 = vpermilps_avx(local_820._0_16_,0xff);
              fVar248 = fVar248 - auVar223._0_4_;
              auVar223 = vshufps_avx(auVar273,auVar273,0xff);
              auVar117 = vfmsub213ss_fma(local_a40._0_16_,ZEXT416((uint)fVar246),auVar223);
              auVar194._0_8_ = auVar122._0_8_ ^ 0x8000000080000000;
              auVar194._8_4_ = auVar122._8_4_ ^ 0x80000000;
              auVar194._12_4_ = auVar122._12_4_ ^ 0x80000000;
              auVar211._0_8_ = auVar117._0_8_ ^ 0x8000000080000000;
              auVar211._8_4_ = auVar117._8_4_ ^ 0x80000000;
              auVar211._12_4_ = auVar117._12_4_ ^ 0x80000000;
              auVar173 = ZEXT416((uint)(auVar173._0_4_ * fVar246));
              auVar122 = vfmsub231ss_fma(ZEXT416((uint)(auVar117._0_4_ * auVar122._0_4_)),auVar296,
                                         auVar173);
              auVar173 = vinsertps_avx(auVar211,auVar173,0x1c);
              uVar112 = auVar122._0_4_;
              auVar212._4_4_ = uVar112;
              auVar212._0_4_ = uVar112;
              auVar212._8_4_ = uVar112;
              auVar212._12_4_ = uVar112;
              auVar173 = vdivps_avx(auVar173,auVar212);
              auVar296 = vinsertps_avx(auVar296,auVar194,0x10);
              auVar296 = vdivps_avx(auVar296,auVar212);
              auVar167._0_4_ = fVar247 * auVar173._0_4_ + fVar248 * auVar296._0_4_;
              auVar167._4_4_ = fVar247 * auVar173._4_4_ + fVar248 * auVar296._4_4_;
              auVar167._8_4_ = fVar247 * auVar173._8_4_ + fVar248 * auVar296._8_4_;
              auVar167._12_4_ = fVar247 * auVar173._12_4_ + fVar248 * auVar296._12_4_;
              auVar173 = vsubps_avx(auVar268._0_16_,auVar167);
              auVar268 = ZEXT1664(auVar173);
              auVar296 = vandps_avx(auVar114,local_8a0._0_16_);
              if (auVar296._0_4_ < auVar275._0_4_) {
                auVar122 = vfmadd231ss_fma(ZEXT416((uint)(auVar281._0_4_ + auVar275._0_4_)),auVar5,
                                           ZEXT416(0x36000000));
                auVar296 = vandps_avx(ZEXT416((uint)fVar248),local_8a0._0_16_);
                if (auVar296._0_4_ < auVar122._0_4_) {
                  fVar239 = auVar173._0_4_ + (float)local_920._0_4_;
                  if (fVar239 < fVar143) {
                    bVar100 = 0;
                    goto LAB_017e9221;
                  }
                  fVar246 = *(float *)(ray + k * 4 + 0x100);
                  auVar275 = ZEXT464((uint)fVar246);
                  if (fVar239 <= fVar246) {
                    auVar296 = vmovshdup_avx(auVar173);
                    bVar100 = 0;
                    if ((auVar296._0_4_ < 0.0) || (1.0 < auVar296._0_4_)) goto LAB_017e9221;
                    auVar6 = vrsqrtss_avx(auVar6,auVar6);
                    fVar247 = auVar6._0_4_;
                    pGVar8 = (context->scene->geometries).items[uVar101].ptr;
                    if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                      bVar100 = 0;
                      goto LAB_017e9221;
                    }
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar100 = 1, pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_017e9221;
                    fVar113 = fVar247 * 1.5 + fVar113 * -0.5 * fVar247 * fVar247 * fVar247;
                    auVar195._0_4_ = fVar113 * (float)local_9c0._0_4_;
                    auVar195._4_4_ = fVar113 * (float)local_9c0._4_4_;
                    auVar195._8_4_ = fVar113 * fStack_9b8;
                    auVar195._12_4_ = fVar113 * fStack_9b4;
                    auVar117 = vfmadd213ps_fma(auVar223,auVar195,auVar273);
                    auVar6 = vshufps_avx(auVar195,auVar195,0xc9);
                    auVar223 = vshufps_avx(auVar273,auVar273,0xc9);
                    auVar196._0_4_ = auVar195._0_4_ * auVar223._0_4_;
                    auVar196._4_4_ = auVar195._4_4_ * auVar223._4_4_;
                    auVar196._8_4_ = auVar195._8_4_ * auVar223._8_4_;
                    auVar196._12_4_ = auVar195._12_4_ * auVar223._12_4_;
                    auVar122 = vfmsub231ps_fma(auVar196,auVar273,auVar6);
                    auVar6 = vshufps_avx(auVar122,auVar122,0xc9);
                    auVar223 = vshufps_avx(auVar117,auVar117,0xc9);
                    auVar122 = vshufps_avx(auVar122,auVar122,0xd2);
                    auVar120._0_4_ = auVar117._0_4_ * auVar122._0_4_;
                    auVar120._4_4_ = auVar117._4_4_ * auVar122._4_4_;
                    auVar120._8_4_ = auVar117._8_4_ * auVar122._8_4_;
                    auVar120._12_4_ = auVar117._12_4_ * auVar122._12_4_;
                    auVar223 = vfmsub231ps_fma(auVar120,auVar6,auVar223);
                    local_3c0 = auVar296._0_8_;
                    auVar6 = vmovshdup_avx(auVar223);
                    local_420._8_8_ = auVar6._0_8_;
                    auVar6 = vshufps_avx(auVar223,auVar223,0xaa);
                    local_400 = auVar6._0_8_;
                    local_3e0 = auVar223._0_4_;
                    local_420._0_8_ = local_420._8_8_;
                    local_420._16_8_ = local_420._8_8_;
                    local_420._24_8_ = local_420._8_8_;
                    uStack_3f8 = local_400;
                    uStack_3f0 = local_400;
                    uStack_3e8 = local_400;
                    uStack_3dc = local_3e0;
                    uStack_3d8 = local_3e0;
                    uStack_3d4 = local_3e0;
                    uStack_3d0 = local_3e0;
                    uStack_3cc = local_3e0;
                    uStack_3c8 = local_3e0;
                    uStack_3c4 = local_3e0;
                    uStack_3b8 = local_3c0;
                    uStack_3b0 = local_3c0;
                    uStack_3a8 = local_3c0;
                    auVar168._12_4_ = 0;
                    auVar168._0_12_ = ZEXT812(0);
                    auVar168 = auVar168 << 0x20;
                    local_3a0 = ZEXT1232(ZEXT812(0)) << 0x20;
                    local_380 = CONCAT44(uStack_67c,local_680);
                    uStack_378 = CONCAT44(uStack_674,uStack_678);
                    uStack_370 = CONCAT44(uStack_66c,uStack_670);
                    uStack_368 = CONCAT44(uStack_664,uStack_668);
                    local_360._4_4_ = uStack_65c;
                    local_360._0_4_ = local_660;
                    local_360._8_4_ = uStack_658;
                    local_360._12_4_ = uStack_654;
                    local_360._16_4_ = uStack_650;
                    local_360._20_4_ = uStack_64c;
                    local_360._24_4_ = uStack_648;
                    local_360._28_4_ = uStack_644;
                    vpcmpeqd_avx2(local_360,local_360);
                    local_340 = context->user->instID[0];
                    uStack_33c = local_340;
                    uStack_338 = local_340;
                    uStack_334 = local_340;
                    uStack_330 = local_340;
                    uStack_32c = local_340;
                    uStack_328 = local_340;
                    uStack_324 = local_340;
                    local_320 = context->user->instPrimID[0];
                    uStack_31c = local_320;
                    uStack_318 = local_320;
                    uStack_314 = local_320;
                    uStack_310 = local_320;
                    uStack_30c = local_320;
                    uStack_308 = local_320;
                    uStack_304 = local_320;
                    *(float *)(ray + k * 4 + 0x100) = fVar239;
                    local_940 = local_6c0;
                    local_a90.valid = (int *)local_940;
                    local_a90.geometryUserPtr = pGVar8->userPtr;
                    local_a90.context = context->user;
                    local_a90.hit = (RTCHitN *)local_420;
                    local_a90.N = 8;
                    local_a90.ray = (RTCRayN *)ray;
                    if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar268 = ZEXT1664(auVar173);
                      auVar281 = ZEXT1664(auVar281._0_16_);
                      auVar293 = ZEXT1664(auVar114);
                      (*pGVar8->occlusionFilterN)(&local_a90);
                      auVar168 = ZEXT816(0) << 0x40;
                    }
                    auVar187 = ZEXT1632(auVar168);
                    auVar126 = vpcmpeqd_avx2(local_940,auVar187);
                    auVar126 = _DAT_01fe9960 & ~auVar126;
                    if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar126 >> 0x7f,0) != '\0') ||
                          (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar126 >> 0xbf,0) != '\0') ||
                        (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar126[0x1f] < '\0') {
                      p_Var9 = context->args->filter;
                      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar268 = ZEXT1664(auVar268._0_16_);
                        auVar281 = ZEXT1664(auVar281._0_16_);
                        auVar293 = ZEXT1664(auVar293._0_16_);
                        (*p_Var9)(&local_a90);
                        auVar187 = ZEXT832(0) << 0x40;
                      }
                      auVar275 = ZEXT464((uint)fVar246);
                      auVar187 = vpcmpeqd_avx2(local_940,auVar187);
                      auVar159._8_4_ = 0xff800000;
                      auVar159._0_8_ = 0xff800000ff800000;
                      auVar159._12_4_ = 0xff800000;
                      auVar159._16_4_ = 0xff800000;
                      auVar159._20_4_ = 0xff800000;
                      auVar159._24_4_ = 0xff800000;
                      auVar159._28_4_ = 0xff800000;
                      auVar126 = vblendvps_avx(auVar159,*(undefined1 (*) [32])
                                                         (local_a90.ray + 0x100),auVar187);
                      *(undefined1 (*) [32])(local_a90.ray + 0x100) = auVar126;
                      auVar126 = _DAT_01fe9960 & ~auVar187;
                      if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar126 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar126 >> 0x7f,0) != '\0') ||
                            (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar126 >> 0xbf,0) != '\0') ||
                          (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar126[0x1f] < '\0') {
                        bVar100 = 1;
                        goto LAB_017e9221;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar246;
                  }
                  auVar275 = ZEXT464((uint)fVar246);
                  bVar100 = 0;
                  goto LAB_017e9221;
                }
              }
              bVar110 = uVar106 < 4;
              uVar106 = uVar106 + 1;
            } while (uVar106 != 5);
            bVar110 = false;
            bVar100 = 5;
LAB_017e9221:
            bVar109 = (bool)(bVar109 | bVar110 & bVar100);
            uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar138._4_4_ = uVar112;
            auVar138._0_4_ = uVar112;
            auVar138._8_4_ = uVar112;
            auVar138._12_4_ = uVar112;
            auVar138._16_4_ = uVar112;
            auVar138._20_4_ = uVar112;
            auVar138._24_4_ = uVar112;
            auVar138._28_4_ = uVar112;
            auVar187 = vcmpps_avx(_local_880,auVar138,2);
            auVar126 = vandps_avx(auVar187,local_700);
            auVar208 = ZEXT3264(auVar126);
            auVar187 = local_700 & auVar187;
            local_700 = auVar126;
          } while ((((((((auVar187 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar187 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar187 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar187 >> 0x7f,0) != '\0') ||
                     (auVar187 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar187 >> 0xbf,0) != '\0') ||
                   (auVar187 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar187[0x1f] < '\0');
          auVar208 = ZEXT3264(local_300);
          auVar263 = ZEXT3264(local_7c0);
        }
        auVar13 = local_300;
        auVar290 = ZEXT3264(auVar271);
        auVar162._0_4_ = fVar111 * (float)local_800._0_4_;
        auVar162._4_4_ = fVar111 * (float)local_800._4_4_;
        auVar162._8_4_ = fVar111 * fStack_7f8;
        auVar162._12_4_ = fVar111 * fStack_7f4;
        auVar162._16_4_ = fVar111 * fStack_7f0;
        auVar162._20_4_ = fVar111 * fStack_7ec;
        auVar162._28_36_ = auVar208._28_36_;
        auVar162._24_4_ = fVar111 * fStack_7e8;
        auVar5 = vfmadd213ps_fma(local_900,_local_a60,auVar162._0_32_);
        auVar5 = vfmadd213ps_fma(local_8e0,_local_860,ZEXT1632(auVar5));
        auVar126 = vandps_avx(ZEXT1632(auVar5),local_8c0);
        auVar184._8_4_ = 0x3e99999a;
        auVar184._0_8_ = 0x3e99999a3e99999a;
        auVar184._12_4_ = 0x3e99999a;
        auVar184._16_4_ = 0x3e99999a;
        auVar184._20_4_ = 0x3e99999a;
        auVar184._24_4_ = 0x3e99999a;
        auVar184._28_4_ = 0x3e99999a;
        auVar126 = vcmpps_avx(auVar126,auVar184,1);
        auVar187 = vorps_avx(auVar126,local_780);
        auVar185._0_4_ = (float)local_9e0._0_4_ + auVar14._0_4_;
        auVar185._4_4_ = (float)local_9e0._4_4_ + auVar14._4_4_;
        auVar185._8_4_ = fStack_9d8 + auVar14._8_4_;
        auVar185._12_4_ = fStack_9d4 + auVar14._12_4_;
        auVar185._16_4_ = fStack_9d0 + auVar14._16_4_;
        auVar185._20_4_ = fStack_9cc + auVar14._20_4_;
        auVar185._24_4_ = fStack_9c8 + auVar14._24_4_;
        auVar185._28_4_ = fStack_9c4 + auVar14._28_4_;
        auVar126 = vcmpps_avx(auVar185,auVar138,2);
        local_8e0 = vandps_avx(auVar263._0_32_,auVar126);
        auVar186._8_4_ = 3;
        auVar186._0_8_ = 0x300000003;
        auVar186._12_4_ = 3;
        auVar186._16_4_ = 3;
        auVar186._20_4_ = 3;
        auVar186._24_4_ = 3;
        auVar186._28_4_ = 3;
        auVar206._8_4_ = 2;
        auVar206._0_8_ = 0x200000002;
        auVar206._12_4_ = 2;
        auVar206._16_4_ = 2;
        auVar206._20_4_ = 2;
        auVar206._24_4_ = 2;
        auVar206._28_4_ = 2;
        auVar126 = vblendvps_avx(auVar206,auVar186,auVar187);
        local_900 = vpcmpgtd_avx2(auVar126,local_7a0);
        auVar126 = vpandn_avx2(local_900,local_8e0);
        auVar187 = local_8e0 & ~local_900;
        local_720 = auVar126;
        if ((((((((auVar187 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar187 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar187 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar187 >> 0x7f,0) != '\0') ||
              (auVar187 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar187 >> 0xbf,0) != '\0') ||
            (auVar187 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar187[0x1f] < '\0') {
          auVar6 = vminps_avx(auVar2,auVar4);
          auVar5 = vmaxps_avx(auVar2,auVar4);
          auVar296 = vminps_avx(auVar3,auVar1);
          auVar114 = vminps_avx(auVar6,auVar296);
          auVar6 = vmaxps_avx(auVar3,auVar1);
          auVar296 = vmaxps_avx(auVar5,auVar6);
          local_a40._8_4_ = NAN;
          local_a40._0_8_ = 0x7fffffff7fffffff;
          local_a40._12_4_ = NAN;
          auVar5 = vandps_avx(auVar114,local_a40._0_16_);
          auVar6 = vandps_avx(auVar296,local_a40._0_16_);
          auVar5 = vmaxps_avx(auVar5,auVar6);
          auVar6 = vmovshdup_avx(auVar5);
          auVar6 = vmaxss_avx(auVar6,auVar5);
          auVar5 = vshufpd_avx(auVar5,auVar5,1);
          auVar5 = vmaxss_avx(auVar5,auVar6);
          fVar209 = auVar5._0_4_ * 1.9073486e-06;
          local_840._0_16_ = vshufps_avx(auVar296,auVar296,0xff);
          local_880._4_4_ = (float)local_9e0._4_4_ + local_300._4_4_;
          local_880._0_4_ = (float)local_9e0._0_4_ + local_300._0_4_;
          fStack_878 = fStack_9d8 + local_300._8_4_;
          fStack_874 = fStack_9d4 + local_300._12_4_;
          fStack_870 = fStack_9d0 + local_300._16_4_;
          fStack_86c = fStack_9cc + local_300._20_4_;
          fStack_868 = fStack_9c8 + local_300._24_4_;
          fStack_864 = fStack_9c4 + local_300._28_4_;
          do {
            auVar140._8_4_ = 0x7f800000;
            auVar140._0_8_ = 0x7f8000007f800000;
            auVar140._12_4_ = 0x7f800000;
            auVar140._16_4_ = 0x7f800000;
            auVar140._20_4_ = 0x7f800000;
            auVar140._24_4_ = 0x7f800000;
            auVar140._28_4_ = 0x7f800000;
            auVar187 = vblendvps_avx(auVar140,auVar13,auVar126);
            auVar14 = vshufps_avx(auVar187,auVar187,0xb1);
            auVar14 = vminps_avx(auVar187,auVar14);
            auVar15 = vshufpd_avx(auVar14,auVar14,5);
            auVar14 = vminps_avx(auVar14,auVar15);
            auVar15 = vpermpd_avx2(auVar14,0x4e);
            auVar14 = vminps_avx(auVar14,auVar15);
            auVar14 = vcmpps_avx(auVar187,auVar14,0);
            auVar15 = auVar126 & auVar14;
            auVar187 = auVar126;
            if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar15 >> 0x7f,0) != '\0') ||
                  (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar15 >> 0xbf,0) != '\0') ||
                (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar15[0x1f] < '\0') {
              auVar187 = vandps_avx(auVar14,auVar126);
            }
            uVar104 = vmovmskps_avx(auVar187);
            iVar17 = 0;
            for (; (uVar104 & 1) == 0; uVar104 = uVar104 >> 1 | 0x80000000) {
              iVar17 = iVar17 + 1;
            }
            uVar105 = iVar17 << 2;
            local_720 = auVar126;
            *(undefined4 *)(local_720 + uVar105) = 0;
            uVar104 = *(uint *)(local_1c0 + uVar105);
            uVar105 = *(uint *)(local_2e0 + uVar105);
            fVar113 = auVar11._0_4_;
            if ((float)local_9a0._0_4_ < 0.0) {
              fVar113 = sqrtf((float)local_9a0._0_4_);
            }
            local_8a0._0_4_ = fVar113 * 1.9073486e-06;
            auVar5 = vinsertps_avx(ZEXT416(uVar105),ZEXT416(uVar104),0x10);
            auVar268 = ZEXT1664(auVar5);
            bVar110 = true;
            uVar106 = 0;
            do {
              uVar112 = auVar268._0_4_;
              auVar121._4_4_ = uVar112;
              auVar121._0_4_ = uVar112;
              auVar121._8_4_ = uVar112;
              auVar121._12_4_ = uVar112;
              auVar296 = vfmadd213ps_fma(auVar121,local_990,_DAT_01f7aa10);
              auVar117 = auVar268._0_16_;
              auVar6 = vmovshdup_avx(auVar117);
              fVar249 = auVar6._0_4_;
              fVar248 = 1.0 - fVar249;
              auVar290 = ZEXT464((uint)fVar248);
              auVar122 = SUB6416(ZEXT464(0x40400000),0);
              auVar223 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar114 = vfmadd213ss_fma(auVar122,auVar6,auVar223);
              auVar5 = vfmadd213ss_fma(auVar114,ZEXT416((uint)(fVar249 * fVar249)),
                                       SUB6416(ZEXT464(0x40000000),0));
              auVar173 = vfmadd213ss_fma(auVar122,ZEXT416((uint)fVar248),auVar223);
              auVar173 = vfmadd213ss_fma(auVar173,ZEXT416((uint)(fVar248 * fVar248)),
                                         SUB6416(ZEXT464(0x40000000),0));
              fVar113 = fVar248 * fVar248 * -fVar249 * 0.5;
              fVar239 = auVar5._0_4_ * 0.5;
              fVar246 = auVar173._0_4_ * 0.5;
              fVar247 = fVar249 * fVar249 * -fVar248 * 0.5;
              auVar197._0_4_ = fVar247 * fVar189;
              auVar197._4_4_ = fVar247 * fStack_b7c;
              auVar197._8_4_ = fVar247 * fStack_b78;
              auVar197._12_4_ = fVar247 * fStack_b74;
              auVar213._4_4_ = fVar246;
              auVar213._0_4_ = fVar246;
              auVar213._8_4_ = fVar246;
              auVar213._12_4_ = fVar246;
              auVar5 = vfmadd132ps_fma(auVar213,auVar197,auVar3);
              auVar169._4_4_ = fVar239;
              auVar169._0_4_ = fVar239;
              auVar169._8_4_ = fVar239;
              auVar169._12_4_ = fVar239;
              auVar5 = vfmadd132ps_fma(auVar169,auVar5,auVar4);
              auVar198._4_4_ = fVar113;
              auVar198._0_4_ = fVar113;
              auVar198._8_4_ = fVar113;
              auVar198._12_4_ = fVar113;
              auVar5 = vfmadd132ps_fma(auVar198,auVar5,auVar2);
              auVar223 = vfmadd231ss_fma(auVar223,auVar6,ZEXT416(0x41100000));
              auVar173 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar6,ZEXT416(0x40800000));
              local_820._0_16_ = auVar5;
              auVar5 = vsubps_avx(auVar296,auVar5);
              _local_9c0 = auVar5;
              auVar5 = vdpps_avx(auVar5,auVar5,0x7f);
              auVar296 = vfmadd213ss_fma(auVar122,auVar6,ZEXT416(0xbf800000));
              fVar113 = auVar5._0_4_;
              if (fVar113 < 0.0) {
                local_a00._0_4_ = auVar114._0_4_;
                local_a20._0_4_ = fVar248 * -2.0;
                auVar281._0_4_ = sqrtf(fVar113);
                auVar281._4_60_ = extraout_var_00;
                auVar290 = ZEXT1664(ZEXT416((uint)fVar248));
                auVar114 = ZEXT416((uint)local_a00._0_4_);
                auVar268 = ZEXT1664(auVar117);
                auVar122 = auVar281._0_16_;
                fVar239 = (float)local_a20._0_4_;
              }
              else {
                auVar122 = vsqrtss_avx(auVar5,auVar5);
                fVar239 = fVar248 * -2.0;
              }
              fVar246 = auVar290._0_4_;
              auVar273 = vfmadd213ss_fma(auVar114,ZEXT416((uint)(fVar249 + fVar249)),
                                         ZEXT416((uint)(fVar249 * fVar249 * 3.0)));
              auVar116 = SUB6416(ZEXT464(0x40000000),0);
              auVar114 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar6,auVar116);
              auVar277 = vfmadd231ss_fma(ZEXT416((uint)(fVar246 * fVar246 * -3.0)),
                                         ZEXT416((uint)(fVar246 + fVar246)),auVar114);
              auVar163 = auVar290._0_16_;
              auVar190 = vfnmadd231ss_fma(ZEXT416((uint)(fVar249 * (fVar246 + fVar246))),auVar163,
                                          auVar163);
              auVar114 = vfmadd213ss_fma(ZEXT416((uint)fVar239),auVar6,
                                         ZEXT416((uint)(fVar249 * fVar249)));
              fVar239 = auVar277._0_4_ * 0.5;
              fVar246 = auVar114._0_4_ * 0.5;
              auVar170._0_4_ = fVar189 * fVar246;
              auVar170._4_4_ = fStack_b7c * fVar246;
              auVar170._8_4_ = fStack_b78 * fVar246;
              auVar170._12_4_ = fStack_b74 * fVar246;
              auVar148._4_4_ = fVar239;
              auVar148._0_4_ = fVar239;
              auVar148._8_4_ = fVar239;
              auVar148._12_4_ = fVar239;
              auVar114 = vfmadd213ps_fma(auVar148,auVar3,auVar170);
              fVar239 = auVar190._0_4_ * 0.5;
              fVar246 = auVar273._0_4_ * 0.5;
              auVar171._4_4_ = fVar246;
              auVar171._0_4_ = fVar246;
              auVar171._8_4_ = fVar246;
              auVar171._12_4_ = fVar246;
              auVar114 = vfmadd213ps_fma(auVar171,auVar4,auVar114);
              auVar270._4_4_ = fVar239;
              auVar270._0_4_ = fVar239;
              auVar270._8_4_ = fVar239;
              auVar270._12_4_ = fVar239;
              auVar273 = vfmadd213ps_fma(auVar270,auVar2,auVar114);
              auVar114 = vfmadd213ss_fma(auVar6,SUB6416(ZEXT464(0xc0400000),0),auVar116);
              local_ba0 = auVar296._0_4_;
              auVar123._0_4_ = fVar189 * local_ba0;
              auVar123._4_4_ = fStack_b7c * local_ba0;
              auVar123._8_4_ = fStack_b78 * local_ba0;
              auVar123._12_4_ = fStack_b74 * local_ba0;
              local_b00 = auVar173._0_4_;
              auVar149._4_4_ = local_b00;
              auVar149._0_4_ = local_b00;
              auVar149._8_4_ = local_b00;
              auVar149._12_4_ = local_b00;
              auVar6 = vfmadd213ps_fma(auVar149,auVar3,auVar123);
              uVar112 = auVar223._0_4_;
              auVar172._4_4_ = uVar112;
              auVar172._0_4_ = uVar112;
              auVar172._8_4_ = uVar112;
              auVar172._12_4_ = uVar112;
              auVar6 = vfmadd213ps_fma(auVar172,auVar4,auVar6);
              auVar296 = vdpps_avx(auVar273,auVar273,0x7f);
              uVar112 = auVar114._0_4_;
              auVar150._4_4_ = uVar112;
              auVar150._0_4_ = uVar112;
              auVar150._8_4_ = uVar112;
              auVar150._12_4_ = uVar112;
              auVar173 = vfmadd213ps_fma(auVar150,auVar2,auVar6);
              auVar6 = vblendps_avx(auVar296,_DAT_01f7aa10,0xe);
              auVar114 = vrsqrtss_avx(auVar6,auVar6);
              fVar247 = auVar296._0_4_;
              fVar239 = auVar114._0_4_;
              auVar114 = vdpps_avx(auVar273,auVar173,0x7f);
              fVar239 = fVar239 * 1.5 + fVar247 * -0.5 * fVar239 * fVar239 * fVar239;
              auVar151._0_4_ = auVar173._0_4_ * fVar247;
              auVar151._4_4_ = auVar173._4_4_ * fVar247;
              auVar151._8_4_ = auVar173._8_4_ * fVar247;
              auVar151._12_4_ = auVar173._12_4_ * fVar247;
              fVar246 = auVar114._0_4_;
              auVar225._0_4_ = auVar273._0_4_ * fVar246;
              auVar225._4_4_ = auVar273._4_4_ * fVar246;
              fVar248 = auVar273._8_4_;
              auVar225._8_4_ = fVar248 * fVar246;
              fVar249 = auVar273._12_4_;
              auVar225._12_4_ = fVar249 * fVar246;
              auVar114 = vsubps_avx(auVar151,auVar225);
              auVar6 = vrcpss_avx(auVar6,auVar6);
              auVar173 = vfnmadd213ss_fma(auVar6,auVar296,auVar116);
              fVar246 = auVar6._0_4_ * auVar173._0_4_;
              auVar6 = vmaxss_avx(ZEXT416((uint)fVar209),
                                  ZEXT416((uint)(auVar268._0_4_ * (float)local_8a0._0_4_)));
              auVar263 = ZEXT1664(auVar6);
              auVar242._0_8_ = auVar273._0_8_ ^ 0x8000000080000000;
              auVar242._8_4_ = -fVar248;
              auVar242._12_4_ = -fVar249;
              auVar199._0_4_ = fVar239 * auVar114._0_4_ * fVar246;
              auVar199._4_4_ = fVar239 * auVar114._4_4_ * fVar246;
              auVar199._8_4_ = fVar239 * auVar114._8_4_ * fVar246;
              auVar199._12_4_ = fVar239 * auVar114._12_4_ * fVar246;
              auVar267._0_4_ = auVar273._0_4_ * fVar239;
              auVar267._4_4_ = auVar273._4_4_ * fVar239;
              auVar267._8_4_ = fVar248 * fVar239;
              auVar267._12_4_ = fVar249 * fVar239;
              if (fVar247 < -fVar247) {
                local_a00._0_16_ = auVar242;
                auVar290 = ZEXT1664(auVar163);
                fVar239 = sqrtf(fVar247);
                auVar263 = ZEXT464(auVar6._0_4_);
                auVar122 = ZEXT416(auVar122._0_4_);
                auVar242 = local_a00._0_16_;
              }
              else {
                auVar296 = vsqrtss_avx(auVar296,auVar296);
                fVar239 = auVar296._0_4_;
              }
              auVar296 = vdpps_avx(_local_9c0,auVar267,0x7f);
              auVar277 = vfmadd213ss_fma(ZEXT416((uint)fVar209),auVar122,auVar263._0_16_);
              auVar114 = vdpps_avx(auVar242,auVar267,0x7f);
              auVar173 = vdpps_avx(_local_9c0,auVar199,0x7f);
              auVar223 = vdpps_avx(local_990,auVar267,0x7f);
              auVar277 = vfmadd213ss_fma(ZEXT416((uint)(auVar122._0_4_ + 1.0)),
                                         ZEXT416((uint)(fVar209 / fVar239)),auVar277);
              auVar275 = ZEXT1664(auVar277);
              fVar239 = auVar114._0_4_ + auVar173._0_4_;
              auVar281 = ZEXT464((uint)fVar239);
              fVar247 = auVar296._0_4_;
              auVar124._0_4_ = fVar247 * fVar247;
              auVar124._4_4_ = auVar296._4_4_ * auVar296._4_4_;
              auVar124._8_4_ = auVar296._8_4_ * auVar296._8_4_;
              auVar124._12_4_ = auVar296._12_4_ * auVar296._12_4_;
              auVar114 = vdpps_avx(_local_9c0,auVar242,0x7f);
              auVar122 = vsubps_avx(auVar5,auVar124);
              auVar173 = vrsqrtss_avx(auVar122,auVar122);
              fVar248 = auVar122._0_4_;
              fVar246 = auVar173._0_4_;
              fVar246 = fVar246 * 1.5 + fVar248 * -0.5 * fVar246 * fVar246 * fVar246;
              auVar173 = vdpps_avx(_local_9c0,local_990,0x7f);
              auVar114 = vfnmadd231ss_fma(auVar114,auVar296,ZEXT416((uint)fVar239));
              auVar173 = vfnmadd231ss_fma(auVar173,auVar296,auVar223);
              if (fVar248 < 0.0) {
                local_a00._0_4_ = auVar277._0_4_;
                local_a20._0_4_ = fVar246;
                local_960._0_16_ = auVar173;
                auVar290 = ZEXT1664(auVar290._0_16_);
                fVar248 = sqrtf(fVar248);
                auVar281 = ZEXT1664(ZEXT416((uint)fVar239));
                auVar275 = ZEXT464((uint)local_a00._0_4_);
                auVar263 = ZEXT464(auVar6._0_4_);
                fVar246 = (float)local_a20._0_4_;
                auVar173 = local_960._0_16_;
              }
              else {
                auVar6 = vsqrtss_avx(auVar122,auVar122);
                fVar248 = auVar6._0_4_;
              }
              auVar293 = ZEXT1664(auVar223);
              auVar6 = vpermilps_avx(local_820._0_16_,0xff);
              fVar248 = fVar248 - auVar6._0_4_;
              auVar122 = vshufps_avx(auVar273,auVar273,0xff);
              auVar6 = vfmsub213ss_fma(auVar114,ZEXT416((uint)fVar246),auVar122);
              auVar200._0_8_ = auVar223._0_8_ ^ 0x8000000080000000;
              auVar200._8_4_ = auVar223._8_4_ ^ 0x80000000;
              auVar200._12_4_ = auVar223._12_4_ ^ 0x80000000;
              auVar214._0_8_ = auVar6._0_8_ ^ 0x8000000080000000;
              auVar214._8_4_ = auVar6._8_4_ ^ 0x80000000;
              auVar214._12_4_ = auVar6._12_4_ ^ 0x80000000;
              auVar173 = ZEXT416((uint)(auVar173._0_4_ * fVar246));
              auVar277 = auVar281._0_16_;
              auVar114 = vfmsub231ss_fma(ZEXT416((uint)(auVar223._0_4_ * auVar6._0_4_)),auVar277,
                                         auVar173);
              auVar6 = vinsertps_avx(auVar214,auVar173,0x1c);
              uVar112 = auVar114._0_4_;
              auVar215._4_4_ = uVar112;
              auVar215._0_4_ = uVar112;
              auVar215._8_4_ = uVar112;
              auVar215._12_4_ = uVar112;
              auVar6 = vdivps_avx(auVar6,auVar215);
              auVar114 = vinsertps_avx(auVar277,auVar200,0x10);
              auVar114 = vdivps_avx(auVar114,auVar215);
              auVar174._0_4_ = fVar247 * auVar6._0_4_ + fVar248 * auVar114._0_4_;
              auVar174._4_4_ = fVar247 * auVar6._4_4_ + fVar248 * auVar114._4_4_;
              auVar174._8_4_ = fVar247 * auVar6._8_4_ + fVar248 * auVar114._8_4_;
              auVar174._12_4_ = fVar247 * auVar6._12_4_ + fVar248 * auVar114._12_4_;
              auVar114 = vsubps_avx(auVar117,auVar174);
              auVar268 = ZEXT1664(auVar114);
              auVar6 = vandps_avx(auVar296,local_a40._0_16_);
              if (auVar6._0_4_ < auVar275._0_4_) {
                auVar296 = vfmadd231ss_fma(ZEXT416((uint)(auVar263._0_4_ + auVar275._0_4_)),
                                           local_840._0_16_,ZEXT416(0x36000000));
                auVar6 = vandps_avx(ZEXT416((uint)fVar248),local_a40._0_16_);
                if (auVar6._0_4_ < auVar296._0_4_) {
                  fVar239 = auVar114._0_4_ + (float)local_920._0_4_;
                  if (fVar239 < fVar143) {
                    bVar100 = 0;
                    goto LAB_017e9dde;
                  }
                  fVar246 = *(float *)(ray + k * 4 + 0x100);
                  auVar263 = ZEXT464((uint)fVar246);
                  if (fVar239 <= fVar246) {
                    auVar6 = vmovshdup_avx(auVar114);
                    bVar100 = 0;
                    if ((auVar6._0_4_ < 0.0) || (1.0 < auVar6._0_4_)) goto LAB_017e9dde;
                    auVar5 = vrsqrtss_avx(auVar5,auVar5);
                    fVar247 = auVar5._0_4_;
                    pGVar8 = (context->scene->geometries).items[uVar101].ptr;
                    if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                      bVar100 = 0;
                      goto LAB_017e9dde;
                    }
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar100 = 1, pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_017e9dde;
                    fVar113 = fVar247 * 1.5 + fVar113 * -0.5 * fVar247 * fVar247 * fVar247;
                    auVar201._0_4_ = fVar113 * (float)local_9c0._0_4_;
                    auVar201._4_4_ = fVar113 * (float)local_9c0._4_4_;
                    auVar201._8_4_ = fVar113 * fStack_9b8;
                    auVar201._12_4_ = fVar113 * fStack_9b4;
                    auVar122 = vfmadd213ps_fma(auVar122,auVar201,auVar273);
                    auVar5 = vshufps_avx(auVar201,auVar201,0xc9);
                    auVar296 = vshufps_avx(auVar273,auVar273,0xc9);
                    auVar202._0_4_ = auVar201._0_4_ * auVar296._0_4_;
                    auVar202._4_4_ = auVar201._4_4_ * auVar296._4_4_;
                    auVar202._8_4_ = auVar201._8_4_ * auVar296._8_4_;
                    auVar202._12_4_ = auVar201._12_4_ * auVar296._12_4_;
                    auVar173 = vfmsub231ps_fma(auVar202,auVar273,auVar5);
                    auVar5 = vshufps_avx(auVar173,auVar173,0xc9);
                    auVar296 = vshufps_avx(auVar122,auVar122,0xc9);
                    auVar173 = vshufps_avx(auVar173,auVar173,0xd2);
                    auVar125._0_4_ = auVar122._0_4_ * auVar173._0_4_;
                    auVar125._4_4_ = auVar122._4_4_ * auVar173._4_4_;
                    auVar125._8_4_ = auVar122._8_4_ * auVar173._8_4_;
                    auVar125._12_4_ = auVar122._12_4_ * auVar173._12_4_;
                    auVar296 = vfmsub231ps_fma(auVar125,auVar5,auVar296);
                    local_3c0 = auVar6._0_8_;
                    auVar5 = vmovshdup_avx(auVar296);
                    local_420._8_8_ = auVar5._0_8_;
                    auVar5 = vshufps_avx(auVar296,auVar296,0xaa);
                    local_400 = auVar5._0_8_;
                    local_3e0 = auVar296._0_4_;
                    local_420._0_8_ = local_420._8_8_;
                    local_420._16_8_ = local_420._8_8_;
                    local_420._24_8_ = local_420._8_8_;
                    uStack_3f8 = local_400;
                    uStack_3f0 = local_400;
                    uStack_3e8 = local_400;
                    uStack_3dc = local_3e0;
                    uStack_3d8 = local_3e0;
                    uStack_3d4 = local_3e0;
                    uStack_3d0 = local_3e0;
                    uStack_3cc = local_3e0;
                    uStack_3c8 = local_3e0;
                    uStack_3c4 = local_3e0;
                    uStack_3b8 = local_3c0;
                    uStack_3b0 = local_3c0;
                    uStack_3a8 = local_3c0;
                    auVar175._12_4_ = 0;
                    auVar175._0_12_ = ZEXT812(0);
                    auVar175 = auVar175 << 0x20;
                    local_3a0 = ZEXT1232(ZEXT812(0)) << 0x20;
                    local_380 = CONCAT44(uStack_67c,local_680);
                    uStack_378 = CONCAT44(uStack_674,uStack_678);
                    uStack_370 = CONCAT44(uStack_66c,uStack_670);
                    uStack_368 = CONCAT44(uStack_664,uStack_668);
                    local_360._4_4_ = uStack_65c;
                    local_360._0_4_ = local_660;
                    local_360._8_4_ = uStack_658;
                    local_360._12_4_ = uStack_654;
                    local_360._16_4_ = uStack_650;
                    local_360._20_4_ = uStack_64c;
                    local_360._24_4_ = uStack_648;
                    local_360._28_4_ = uStack_644;
                    vpcmpeqd_avx2(local_360,local_360);
                    local_340 = context->user->instID[0];
                    uStack_33c = local_340;
                    uStack_338 = local_340;
                    uStack_334 = local_340;
                    uStack_330 = local_340;
                    uStack_32c = local_340;
                    uStack_328 = local_340;
                    uStack_324 = local_340;
                    local_320 = context->user->instPrimID[0];
                    uStack_31c = local_320;
                    uStack_318 = local_320;
                    uStack_314 = local_320;
                    uStack_310 = local_320;
                    uStack_30c = local_320;
                    uStack_308 = local_320;
                    uStack_304 = local_320;
                    *(float *)(ray + k * 4 + 0x100) = fVar239;
                    local_940 = local_6c0;
                    local_a90.valid = (int *)local_940;
                    local_a90.geometryUserPtr = pGVar8->userPtr;
                    local_a90.context = context->user;
                    local_a90.hit = (RTCHitN *)local_420;
                    local_a90.N = 8;
                    local_a90.ray = (RTCRayN *)ray;
                    if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar268 = ZEXT1664(auVar114);
                      auVar275 = ZEXT1664(auVar275._0_16_);
                      auVar281 = ZEXT1664(auVar277);
                      auVar290 = ZEXT1664(auVar290._0_16_);
                      auVar293 = ZEXT1664(auVar223);
                      (*pGVar8->occlusionFilterN)(&local_a90);
                      auVar175 = ZEXT816(0) << 0x40;
                    }
                    auVar187 = ZEXT1632(auVar175);
                    auVar126 = vpcmpeqd_avx2(local_940,auVar187);
                    auVar126 = _DAT_01fe9960 & ~auVar126;
                    if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar126 >> 0x7f,0) != '\0') ||
                          (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar126 >> 0xbf,0) != '\0') ||
                        (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar126[0x1f] < '\0') {
                      p_Var9 = context->args->filter;
                      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar268 = ZEXT1664(auVar268._0_16_);
                        auVar275 = ZEXT1664(auVar275._0_16_);
                        auVar281 = ZEXT1664(auVar281._0_16_);
                        auVar290 = ZEXT1664(auVar290._0_16_);
                        auVar293 = ZEXT1664(auVar293._0_16_);
                        (*p_Var9)(&local_a90);
                        auVar187 = ZEXT832(0) << 0x40;
                      }
                      auVar263 = ZEXT464((uint)fVar246);
                      auVar187 = vpcmpeqd_avx2(local_940,auVar187);
                      auVar160._8_4_ = 0xff800000;
                      auVar160._0_8_ = 0xff800000ff800000;
                      auVar160._12_4_ = 0xff800000;
                      auVar160._16_4_ = 0xff800000;
                      auVar160._20_4_ = 0xff800000;
                      auVar160._24_4_ = 0xff800000;
                      auVar160._28_4_ = 0xff800000;
                      auVar126 = vblendvps_avx(auVar160,*(undefined1 (*) [32])
                                                         (local_a90.ray + 0x100),auVar187);
                      *(undefined1 (*) [32])(local_a90.ray + 0x100) = auVar126;
                      auVar126 = _DAT_01fe9960 & ~auVar187;
                      if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar126 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar126 >> 0x7f,0) != '\0') ||
                            (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar126 >> 0xbf,0) != '\0') ||
                          (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar126[0x1f] < '\0') {
                        bVar100 = 1;
                        goto LAB_017e9dde;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar246;
                  }
                  auVar263 = ZEXT464((uint)fVar246);
                  bVar100 = 0;
                  goto LAB_017e9dde;
                }
              }
              bVar110 = uVar106 < 4;
              uVar106 = uVar106 + 1;
            } while (uVar106 != 5);
            bVar110 = false;
            bVar100 = 5;
LAB_017e9dde:
            bVar109 = (bool)(bVar109 | bVar110 & bVar100);
            uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar138._4_4_ = uVar112;
            auVar138._0_4_ = uVar112;
            auVar138._8_4_ = uVar112;
            auVar138._12_4_ = uVar112;
            auVar138._16_4_ = uVar112;
            auVar138._20_4_ = uVar112;
            auVar138._24_4_ = uVar112;
            auVar138._28_4_ = uVar112;
            auVar187 = vcmpps_avx(_local_880,auVar138,2);
            auVar126 = vandps_avx(auVar187,local_720);
            auVar187 = local_720 & auVar187;
            local_720 = auVar126;
          } while ((((((((auVar187 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar187 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar187 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar187 >> 0x7f,0) != '\0') ||
                     (auVar187 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar187 >> 0xbf,0) != '\0') ||
                   (auVar187 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar187[0x1f] < '\0');
        }
        auVar188._0_4_ = (float)local_9e0._0_4_ + local_460._0_4_;
        auVar188._4_4_ = (float)local_9e0._4_4_ + local_460._4_4_;
        auVar188._8_4_ = fStack_9d8 + local_460._8_4_;
        auVar188._12_4_ = fStack_9d4 + local_460._12_4_;
        auVar188._16_4_ = fStack_9d0 + local_460._16_4_;
        auVar188._20_4_ = fStack_9cc + local_460._20_4_;
        auVar188._24_4_ = fStack_9c8 + local_460._24_4_;
        auVar188._28_4_ = fStack_9c4 + local_460._28_4_;
        auVar187 = vcmpps_avx(auVar188,auVar138,2);
        auVar126 = vandps_avx(local_760,local_740);
        auVar126 = vandps_avx(auVar187,auVar126);
        auVar207._0_4_ = (float)local_9e0._0_4_ + local_300._0_4_;
        auVar207._4_4_ = (float)local_9e0._4_4_ + local_300._4_4_;
        auVar207._8_4_ = fStack_9d8 + local_300._8_4_;
        auVar207._12_4_ = fStack_9d4 + local_300._12_4_;
        auVar207._16_4_ = fStack_9d0 + local_300._16_4_;
        auVar207._20_4_ = fStack_9cc + local_300._20_4_;
        auVar207._24_4_ = fStack_9c8 + local_300._24_4_;
        auVar207._28_4_ = fStack_9c4 + local_300._28_4_;
        auVar13 = vcmpps_avx(auVar207,auVar138,2);
        auVar187 = vandps_avx(local_900,local_8e0);
        auVar187 = vandps_avx(auVar13,auVar187);
        auVar187 = vorps_avx(auVar126,auVar187);
        if ((((((((auVar187 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar187 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar187 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar187 >> 0x7f,0) != '\0') ||
              (auVar187 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar187 >> 0xbf,0) != '\0') ||
            (auVar187 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar187[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar107 * 0x60) = auVar187;
          auVar126 = vblendvps_avx(local_300,local_460,auVar126);
          *(undefined1 (*) [32])(auStack_160 + uVar107 * 0x60) = auVar126;
          uVar240 = vmovlps_avx(local_6d0);
          (&uStack_140)[uVar107 * 0xc] = uVar240;
          aiStack_138[uVar107 * 0x18] = local_c88 + 1;
          iVar102 = iVar102 + 1;
        }
      }
    }
    if (iVar102 == 0) break;
    uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar135._4_4_ = uVar112;
    auVar135._0_4_ = uVar112;
    auVar135._8_4_ = uVar112;
    auVar135._12_4_ = uVar112;
    auVar135._16_4_ = uVar112;
    auVar135._20_4_ = uVar112;
    auVar135._24_4_ = uVar112;
    auVar135._28_4_ = uVar112;
    uVar104 = -iVar102;
    pauVar103 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar102 - 1) * 0x60);
    fVar209 = (float)local_9e0._0_4_;
    fVar113 = (float)local_9e0._4_4_;
    fVar239 = fStack_9d8;
    fVar246 = fStack_9d4;
    fVar247 = fStack_9d0;
    fVar248 = fStack_9cc;
    fVar249 = fStack_9c8;
    fVar250 = fStack_9c4;
    while( true ) {
      auVar126 = pauVar103[1];
      auVar155._0_4_ = fVar209 + auVar126._0_4_;
      auVar155._4_4_ = fVar113 + auVar126._4_4_;
      auVar155._8_4_ = fVar239 + auVar126._8_4_;
      auVar155._12_4_ = fVar246 + auVar126._12_4_;
      auVar155._16_4_ = fVar247 + auVar126._16_4_;
      auVar155._20_4_ = fVar248 + auVar126._20_4_;
      auVar155._24_4_ = fVar249 + auVar126._24_4_;
      auVar155._28_4_ = fVar250 + auVar126._28_4_;
      auVar13 = vcmpps_avx(auVar155,auVar135,2);
      auVar187 = vandps_avx(auVar13,*pauVar103);
      local_420 = auVar187;
      auVar13 = *pauVar103 & auVar13;
      if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar13 >> 0x7f,0) != '\0') ||
            (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0xbf,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar13[0x1f] < '\0') break;
      pauVar103 = pauVar103 + -3;
      uVar104 = uVar104 + 1;
      fVar209 = (float)local_9e0._0_4_;
      fVar113 = (float)local_9e0._4_4_;
      fVar239 = fStack_9d8;
      fVar246 = fStack_9d4;
      fVar247 = fStack_9d0;
      fVar248 = fStack_9cc;
      fVar249 = fStack_9c8;
      fVar250 = fStack_9c4;
      if (uVar104 == 0) goto LAB_017ea2dd;
    }
    auVar136._8_4_ = 0x7f800000;
    auVar136._0_8_ = 0x7f8000007f800000;
    auVar136._12_4_ = 0x7f800000;
    auVar136._16_4_ = 0x7f800000;
    auVar136._20_4_ = 0x7f800000;
    auVar136._24_4_ = 0x7f800000;
    auVar136._28_4_ = 0x7f800000;
    auVar126 = vblendvps_avx(auVar136,auVar126,auVar187);
    auVar13 = vshufps_avx(auVar126,auVar126,0xb1);
    auVar13 = vminps_avx(auVar126,auVar13);
    auVar14 = vshufpd_avx(auVar13,auVar13,5);
    auVar13 = vminps_avx(auVar13,auVar14);
    auVar14 = vpermpd_avx2(auVar13,0x4e);
    auVar208 = ZEXT3264(auVar14);
    auVar13 = vminps_avx(auVar13,auVar14);
    auVar126 = vcmpps_avx(auVar126,auVar13,0);
    auVar13 = auVar187 & auVar126;
    if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0x7f,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0xbf,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0')
    {
      auVar187 = vandps_avx(auVar126,auVar187);
    }
    uVar106 = *(ulong *)pauVar103[2];
    auVar115._8_8_ = 0;
    auVar115._0_8_ = uVar106;
    uVar105 = vmovmskps_avx(auVar187);
    iVar102 = 0;
    for (; (uVar105 & 1) == 0; uVar105 = uVar105 >> 1 | 0x80000000) {
      iVar102 = iVar102 + 1;
    }
    *(undefined4 *)(local_420 + (uint)(iVar102 << 2)) = 0;
    uVar105 = ~uVar104;
    if ((((((((local_420 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_420 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_420 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_420 >> 0x7f,0) != '\0') ||
          (local_420 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_420 >> 0xbf,0) != '\0') ||
        (local_420 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_420[0x1f] < '\0') {
      uVar105 = -uVar104;
    }
    uVar107 = (ulong)uVar105;
    local_c88 = *(int *)(pauVar103[2] + 8);
    *pauVar103 = local_420;
    uVar112 = (undefined4)uVar106;
    auVar156._4_4_ = uVar112;
    auVar156._0_4_ = uVar112;
    auVar156._8_4_ = uVar112;
    auVar156._12_4_ = uVar112;
    auVar156._16_4_ = uVar112;
    auVar156._20_4_ = uVar112;
    auVar156._24_4_ = uVar112;
    auVar156._28_4_ = uVar112;
    auVar5 = vmovshdup_avx(auVar115);
    auVar5 = vsubps_avx(auVar5,auVar115);
    auVar137._0_4_ = auVar5._0_4_;
    auVar137._4_4_ = auVar137._0_4_;
    auVar137._8_4_ = auVar137._0_4_;
    auVar137._12_4_ = auVar137._0_4_;
    auVar137._16_4_ = auVar137._0_4_;
    auVar137._20_4_ = auVar137._0_4_;
    auVar137._24_4_ = auVar137._0_4_;
    auVar137._28_4_ = auVar137._0_4_;
    auVar5 = vfmadd132ps_fma(auVar137,auVar156,_DAT_01faff20);
    local_460 = ZEXT1632(auVar5);
    auVar238 = ZEXT864(*(ulong *)(local_460 + (uint)(iVar102 << 2)));
  } while( true );
LAB_017ea2dd:
  if (bVar109 != false) {
    return bVar109;
  }
  uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar142._4_4_ = uVar112;
  auVar142._0_4_ = uVar112;
  auVar142._8_4_ = uVar112;
  auVar142._12_4_ = uVar112;
  auVar142._16_4_ = uVar112;
  auVar142._20_4_ = uVar112;
  auVar142._24_4_ = uVar112;
  auVar142._28_4_ = uVar112;
  auVar126 = vcmpps_avx(local_260,auVar142,2);
  uVar101 = vmovmskps_avx(auVar126);
  uVar101 = (uint)local_908 & uVar101;
  if (uVar101 == 0) {
    return false;
  }
  goto LAB_017e78e8;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }